

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  long lVar70;
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  bool bVar81;
  ulong uVar82;
  ulong uVar83;
  byte bVar84;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ulong uVar85;
  long lVar86;
  uint uVar87;
  ulong uVar88;
  bool bVar89;
  ulong uVar90;
  float fVar91;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar139;
  float fVar141;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar97 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar98 [16];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar147;
  undefined4 uVar148;
  undefined8 uVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar160;
  float fVar165;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar177;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar166;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar175;
  float fVar176;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  ulong local_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  int iStack_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int iStack_648;
  int iStack_644;
  undefined1 local_640 [16];
  undefined4 local_630;
  undefined4 uStack_62c;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  long local_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  RTCHitN local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  int local_31c;
  undefined1 local_310 [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  byte local_2d0;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar90 = (ulong)(byte)PVar9;
  lVar71 = uVar90 * 0x19;
  fVar166 = *(float *)(prim + lVar71 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar95 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar97 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + lVar71 + 6));
  fVar159 = fVar166 * auVar97._0_4_;
  fVar147 = fVar166 * auVar95._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar90 * 4 + 6);
  auVar107 = vpmovsxbd_avx2(auVar20);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar90 * 5 + 6);
  auVar105 = vpmovsxbd_avx2(auVar94);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar90 * 6 + 6);
  auVar106 = vpmovsxbd_avx2(auVar96);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar90 * 0xb + 6);
  auVar118 = vpmovsxbd_avx2(auVar93);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar117 = vpmovsxbd_avx2(auVar92);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar90 + 6);
  auVar116 = vpmovsxbd_avx2(auVar5);
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar88 = (ulong)(uint)((int)(uVar90 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar108 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar88 + uVar90 + 6);
  auVar114 = vpmovsxbd_avx2(auVar7);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar109 = vcvtdq2ps_avx(auVar114);
  uVar83 = (ulong)(uint)((int)(uVar90 * 5) << 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar103 = vpmovsxbd_avx2(auVar8);
  auVar115 = vcvtdq2ps_avx(auVar103);
  auVar190._4_4_ = fVar147;
  auVar190._0_4_ = fVar147;
  auVar190._8_4_ = fVar147;
  auVar190._12_4_ = fVar147;
  auVar190._16_4_ = fVar147;
  auVar190._20_4_ = fVar147;
  auVar190._24_4_ = fVar147;
  auVar190._28_4_ = fVar147;
  auVar193._8_4_ = 1;
  auVar193._0_8_ = 0x100000001;
  auVar193._12_4_ = 1;
  auVar193._16_4_ = 1;
  auVar193._20_4_ = 1;
  auVar193._24_4_ = 1;
  auVar193._28_4_ = 1;
  auVar110 = ZEXT1632(CONCAT412(fVar166 * auVar95._12_4_,
                                CONCAT48(fVar166 * auVar95._8_4_,
                                         CONCAT44(fVar166 * auVar95._4_4_,fVar147))));
  auVar104 = vpermps_avx2(auVar193,auVar110);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = vpermps_avx512vl(auVar101,auVar110);
  fVar147 = auVar102._0_4_;
  fVar175 = auVar102._4_4_;
  auVar110._4_4_ = fVar175 * auVar106._4_4_;
  auVar110._0_4_ = fVar147 * auVar106._0_4_;
  fVar176 = auVar102._8_4_;
  auVar110._8_4_ = fVar176 * auVar106._8_4_;
  fVar177 = auVar102._12_4_;
  auVar110._12_4_ = fVar177 * auVar106._12_4_;
  fVar160 = auVar102._16_4_;
  auVar110._16_4_ = fVar160 * auVar106._16_4_;
  fVar165 = auVar102._20_4_;
  auVar110._20_4_ = fVar165 * auVar106._20_4_;
  fVar91 = auVar102._24_4_;
  auVar110._24_4_ = fVar91 * auVar106._24_4_;
  auVar110._28_4_ = auVar114._28_4_;
  auVar114._4_4_ = auVar116._4_4_ * fVar175;
  auVar114._0_4_ = auVar116._0_4_ * fVar147;
  auVar114._8_4_ = auVar116._8_4_ * fVar176;
  auVar114._12_4_ = auVar116._12_4_ * fVar177;
  auVar114._16_4_ = auVar116._16_4_ * fVar160;
  auVar114._20_4_ = auVar116._20_4_ * fVar165;
  auVar114._24_4_ = auVar116._24_4_ * fVar91;
  auVar114._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar115._4_4_ * fVar175;
  auVar103._0_4_ = auVar115._0_4_ * fVar147;
  auVar103._8_4_ = auVar115._8_4_ * fVar176;
  auVar103._12_4_ = auVar115._12_4_ * fVar177;
  auVar103._16_4_ = auVar115._16_4_ * fVar160;
  auVar103._20_4_ = auVar115._20_4_ * fVar165;
  auVar103._24_4_ = auVar115._24_4_ * fVar91;
  auVar103._28_4_ = auVar102._28_4_;
  auVar20 = vfmadd231ps_fma(auVar110,auVar104,auVar105);
  auVar94 = vfmadd231ps_fma(auVar114,auVar104,auVar117);
  auVar96 = vfmadd231ps_fma(auVar103,auVar109,auVar104);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar190,auVar107);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar190,auVar118);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar108,auVar190);
  auVar191._4_4_ = fVar159;
  auVar191._0_4_ = fVar159;
  auVar191._8_4_ = fVar159;
  auVar191._12_4_ = fVar159;
  auVar191._16_4_ = fVar159;
  auVar191._20_4_ = fVar159;
  auVar191._24_4_ = fVar159;
  auVar191._28_4_ = fVar159;
  auVar103 = ZEXT1632(CONCAT412(fVar166 * auVar97._12_4_,
                                CONCAT48(fVar166 * auVar97._8_4_,
                                         CONCAT44(fVar166 * auVar97._4_4_,fVar159))));
  auVar114 = vpermps_avx2(auVar193,auVar103);
  auVar103 = vpermps_avx512vl(auVar101,auVar103);
  auVar104 = vmulps_avx512vl(auVar103,auVar106);
  auVar112._0_4_ = auVar103._0_4_ * auVar116._0_4_;
  auVar112._4_4_ = auVar103._4_4_ * auVar116._4_4_;
  auVar112._8_4_ = auVar103._8_4_ * auVar116._8_4_;
  auVar112._12_4_ = auVar103._12_4_ * auVar116._12_4_;
  auVar112._16_4_ = auVar103._16_4_ * auVar116._16_4_;
  auVar112._20_4_ = auVar103._20_4_ * auVar116._20_4_;
  auVar112._24_4_ = auVar103._24_4_ * auVar116._24_4_;
  auVar112._28_4_ = 0;
  auVar116._4_4_ = auVar103._4_4_ * auVar115._4_4_;
  auVar116._0_4_ = auVar103._0_4_ * auVar115._0_4_;
  auVar116._8_4_ = auVar103._8_4_ * auVar115._8_4_;
  auVar116._12_4_ = auVar103._12_4_ * auVar115._12_4_;
  auVar116._16_4_ = auVar103._16_4_ * auVar115._16_4_;
  auVar116._20_4_ = auVar103._20_4_ * auVar115._20_4_;
  auVar116._24_4_ = auVar103._24_4_ * auVar115._24_4_;
  auVar116._28_4_ = auVar106._28_4_;
  auVar105 = vfmadd231ps_avx512vl(auVar104,auVar114,auVar105);
  auVar93 = vfmadd231ps_fma(auVar112,auVar114,auVar117);
  auVar92 = vfmadd231ps_fma(auVar116,auVar114,auVar109);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar191,auVar107);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar191,auVar118);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar191,auVar108);
  auVar181._8_4_ = 0x7fffffff;
  auVar181._0_8_ = 0x7fffffff7fffffff;
  auVar181._12_4_ = 0x7fffffff;
  auVar181._16_4_ = 0x7fffffff;
  auVar181._20_4_ = 0x7fffffff;
  auVar181._24_4_ = 0x7fffffff;
  auVar181._28_4_ = 0x7fffffff;
  auVar107 = vandps_avx(ZEXT1632(auVar20),auVar181);
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar129._16_4_ = 0x219392ef;
  auVar129._20_4_ = 0x219392ef;
  auVar129._24_4_ = 0x219392ef;
  auVar129._28_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar107,auVar129,1);
  bVar89 = (bool)((byte)uVar88 & 1);
  auVar104._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar20._0_4_;
  bVar89 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar20._4_4_;
  bVar89 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar20._8_4_;
  bVar89 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar20._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar107 = vandps_avx(ZEXT1632(auVar94),auVar181);
  uVar88 = vcmpps_avx512vl(auVar107,auVar129,1);
  bVar89 = (bool)((byte)uVar88 & 1);
  auVar101._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._0_4_;
  bVar89 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._4_4_;
  bVar89 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._8_4_;
  bVar89 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar107 = vandps_avx(ZEXT1632(auVar96),auVar181);
  uVar88 = vcmpps_avx512vl(auVar107,auVar129,1);
  bVar89 = (bool)((byte)uVar88 & 1);
  auVar107._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._0_4_;
  bVar89 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._4_4_;
  bVar89 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._8_4_;
  bVar89 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar96._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar106 = vrcp14ps_avx512vl(auVar104);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = &DAT_3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar180._16_4_ = 0x3f800000;
  auVar180._20_4_ = 0x3f800000;
  auVar180._24_4_ = 0x3f800000;
  auVar180._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar104,auVar106,auVar180);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar101);
  auVar94 = vfnmadd213ps_fma(auVar101,auVar106,auVar180);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar107);
  auVar96 = vfnmadd213ps_fma(auVar107,auVar106,auVar180);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar106,auVar106);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 7 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar106 = vsubps_avx512vl(auVar107,auVar105);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 9 + 6));
  auVar108._4_4_ = auVar20._4_4_ * auVar106._4_4_;
  auVar108._0_4_ = auVar20._0_4_ * auVar106._0_4_;
  auVar108._8_4_ = auVar20._8_4_ * auVar106._8_4_;
  auVar108._12_4_ = auVar20._12_4_ * auVar106._12_4_;
  auVar108._16_4_ = auVar106._16_4_ * 0.0;
  auVar108._20_4_ = auVar106._20_4_ * 0.0;
  auVar108._24_4_ = auVar106._24_4_ * 0.0;
  auVar108._28_4_ = auVar106._28_4_;
  auVar179 = ZEXT3264(auVar108);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx512vl(auVar107,auVar105);
  auVar113._0_4_ = auVar20._0_4_ * auVar107._0_4_;
  auVar113._4_4_ = auVar20._4_4_ * auVar107._4_4_;
  auVar113._8_4_ = auVar20._8_4_ * auVar107._8_4_;
  auVar113._12_4_ = auVar20._12_4_ * auVar107._12_4_;
  auVar113._16_4_ = auVar107._16_4_ * 0.0;
  auVar113._20_4_ = auVar107._20_4_ * 0.0;
  auVar113._24_4_ = auVar107._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar90 * -2 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar93));
  auVar109._4_4_ = auVar94._4_4_ * auVar107._4_4_;
  auVar109._0_4_ = auVar94._0_4_ * auVar107._0_4_;
  auVar109._8_4_ = auVar94._8_4_ * auVar107._8_4_;
  auVar109._12_4_ = auVar94._12_4_ * auVar107._12_4_;
  auVar109._16_4_ = auVar107._16_4_ * 0.0;
  auVar109._20_4_ = auVar107._20_4_ * 0.0;
  auVar109._24_4_ = auVar107._24_4_ * 0.0;
  auVar109._28_4_ = auVar107._28_4_;
  auVar107 = vcvtdq2ps_avx(auVar105);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar93));
  auVar111._0_4_ = auVar94._0_4_ * auVar107._0_4_;
  auVar111._4_4_ = auVar94._4_4_ * auVar107._4_4_;
  auVar111._8_4_ = auVar94._8_4_ * auVar107._8_4_;
  auVar111._12_4_ = auVar94._12_4_ * auVar107._12_4_;
  auVar111._16_4_ = auVar107._16_4_ * 0.0;
  auVar111._20_4_ = auVar107._20_4_ * 0.0;
  auVar111._24_4_ = auVar107._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar90 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar92));
  auVar115._4_4_ = auVar107._4_4_ * auVar96._4_4_;
  auVar115._0_4_ = auVar107._0_4_ * auVar96._0_4_;
  auVar115._8_4_ = auVar107._8_4_ * auVar96._8_4_;
  auVar115._12_4_ = auVar107._12_4_ * auVar96._12_4_;
  auVar115._16_4_ = auVar107._16_4_ * 0.0;
  auVar115._20_4_ = auVar107._20_4_ * 0.0;
  auVar115._24_4_ = auVar107._24_4_ * 0.0;
  auVar115._28_4_ = auVar107._28_4_;
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x17 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar92));
  auVar102._0_4_ = auVar96._0_4_ * auVar107._0_4_;
  auVar102._4_4_ = auVar96._4_4_ * auVar107._4_4_;
  auVar102._8_4_ = auVar96._8_4_ * auVar107._8_4_;
  auVar102._12_4_ = auVar96._12_4_ * auVar107._12_4_;
  auVar102._16_4_ = auVar107._16_4_ * 0.0;
  auVar102._20_4_ = auVar107._20_4_ * 0.0;
  auVar102._24_4_ = auVar107._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar107 = vpminsd_avx2(auVar108,auVar113);
  auVar105 = vpminsd_avx2(auVar109,auVar111);
  auVar107 = vmaxps_avx(auVar107,auVar105);
  auVar105 = vpminsd_avx2(auVar115,auVar102);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar106._4_4_ = uVar148;
  auVar106._0_4_ = uVar148;
  auVar106._8_4_ = uVar148;
  auVar106._12_4_ = uVar148;
  auVar106._16_4_ = uVar148;
  auVar106._20_4_ = uVar148;
  auVar106._24_4_ = uVar148;
  auVar106._28_4_ = uVar148;
  auVar105 = vmaxps_avx512vl(auVar105,auVar106);
  auVar107 = vmaxps_avx(auVar107,auVar105);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  auVar105._16_4_ = 0x3f7ffffa;
  auVar105._20_4_ = 0x3f7ffffa;
  auVar105._24_4_ = 0x3f7ffffa;
  auVar105._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar107,auVar105);
  auVar107 = vpmaxsd_avx2(auVar108,auVar113);
  auVar158 = ZEXT3264(auVar107);
  auVar105 = vpmaxsd_avx2(auVar109,auVar111);
  auVar107 = vminps_avx(auVar107,auVar105);
  auVar105 = vpmaxsd_avx2(auVar115,auVar102);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar118._4_4_ = uVar148;
  auVar118._0_4_ = uVar148;
  auVar118._8_4_ = uVar148;
  auVar118._12_4_ = uVar148;
  auVar118._16_4_ = uVar148;
  auVar118._20_4_ = uVar148;
  auVar118._24_4_ = uVar148;
  auVar118._28_4_ = uVar148;
  auVar105 = vminps_avx512vl(auVar105,auVar118);
  auVar107 = vminps_avx(auVar107,auVar105);
  auVar117._8_4_ = 0x3f800003;
  auVar117._0_8_ = 0x3f8000033f800003;
  auVar117._12_4_ = 0x3f800003;
  auVar117._16_4_ = 0x3f800003;
  auVar117._20_4_ = 0x3f800003;
  auVar117._24_4_ = 0x3f800003;
  auVar117._28_4_ = 0x3f800003;
  auVar107 = vmulps_avx512vl(auVar107,auVar117);
  auVar105 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar105,_DAT_0205a920);
  uVar149 = vcmpps_avx512vl(local_80,auVar107,2);
  bVar89 = (byte)((byte)uVar149 & (byte)uVar21) != 0;
  if (bVar89) {
    uVar88 = (ulong)(byte)((byte)uVar149 & (byte)uVar21);
    local_4a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar105 = auVar179._0_32_;
      auVar107 = auVar158._0_32_;
      local_500 = in_ZMM20._0_32_;
      lVar86 = 0;
      for (uVar90 = uVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
        lVar86 = lVar86 + 1;
      }
      uVar88 = uVar88 - 1 & uVar88;
      uVar90 = (ulong)(uint)((int)lVar86 << 6);
      local_698 = (ulong)*(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[local_698].ptr;
      auVar20 = *(undefined1 (*) [16])(prim + uVar90 + lVar71 + 0x16);
      if (uVar88 != 0) {
        uVar82 = uVar88 - 1 & uVar88;
        for (uVar83 = uVar88; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        }
        if (uVar82 != 0) {
          for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_470 = *(undefined1 (*) [16])(prim + uVar90 + lVar71 + 0x26);
      local_480 = *(undefined1 (*) [16])(prim + uVar90 + lVar71 + 0x36);
      local_490 = *(undefined1 (*) [16])(prim + uVar90 + lVar71 + 0x46);
      local_540._0_8_ = pGVar11;
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar93 = vsubps_avx(auVar20,auVar94);
      uVar148 = auVar93._0_4_;
      auVar95._4_4_ = uVar148;
      auVar95._0_4_ = uVar148;
      auVar95._8_4_ = uVar148;
      auVar95._12_4_ = uVar148;
      auVar96 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar166 = pre->ray_space[k].vz.field_0.m128[0];
      fVar147 = pre->ray_space[k].vz.field_0.m128[1];
      fVar175 = pre->ray_space[k].vz.field_0.m128[2];
      fVar176 = pre->ray_space[k].vz.field_0.m128[3];
      auVar98._0_4_ = fVar166 * auVar93._0_4_;
      auVar98._4_4_ = fVar147 * auVar93._4_4_;
      auVar98._8_4_ = fVar175 * auVar93._8_4_;
      auVar98._12_4_ = fVar176 * auVar93._12_4_;
      auVar96 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar96);
      auVar5 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar3,auVar95);
      auVar96 = vshufps_avx(auVar20,auVar20,0xff);
      auVar92 = vsubps_avx(local_470,auVar94);
      uVar148 = auVar92._0_4_;
      auVar161._4_4_ = uVar148;
      auVar161._0_4_ = uVar148;
      auVar161._8_4_ = uVar148;
      auVar161._12_4_ = uVar148;
      auVar93 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar184._0_4_ = fVar166 * auVar92._0_4_;
      auVar184._4_4_ = fVar147 * auVar92._4_4_;
      auVar184._8_4_ = fVar175 * auVar92._8_4_;
      auVar184._12_4_ = fVar176 * auVar92._12_4_;
      auVar93 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar4,auVar93);
      auVar6 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar3,auVar161);
      auVar92 = vsubps_avx512vl(local_480,auVar94);
      uVar148 = auVar92._0_4_;
      auVar162._4_4_ = uVar148;
      auVar162._0_4_ = uVar148;
      auVar162._8_4_ = uVar148;
      auVar162._12_4_ = uVar148;
      auVar93 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar186._0_4_ = fVar166 * auVar92._0_4_;
      auVar186._4_4_ = fVar147 * auVar92._4_4_;
      auVar186._8_4_ = fVar175 * auVar92._8_4_;
      auVar186._12_4_ = fVar176 * auVar92._12_4_;
      auVar93 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar4,auVar93);
      auVar92 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar3,auVar162);
      auVar93 = vsubps_avx512vl(local_490,auVar94);
      uVar148 = auVar93._0_4_;
      auVar97._4_4_ = uVar148;
      auVar97._0_4_ = uVar148;
      auVar97._8_4_ = uVar148;
      auVar97._12_4_ = uVar148;
      auVar94 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar187._0_4_ = fVar166 * auVar93._0_4_;
      auVar187._4_4_ = fVar147 * auVar93._4_4_;
      auVar187._8_4_ = fVar175 * auVar93._8_4_;
      auVar187._12_4_ = fVar176 * auVar93._12_4_;
      auVar94 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar4,auVar94);
      auVar93 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar97);
      lVar70 = (long)iVar10 * 0x44;
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar70);
      uVar148 = auVar5._0_4_;
      local_4c0._4_4_ = uVar148;
      local_4c0._0_4_ = uVar148;
      local_4c0._8_4_ = uVar148;
      local_4c0._12_4_ = uVar148;
      local_4c0._16_4_ = uVar148;
      local_4c0._20_4_ = uVar148;
      local_4c0._24_4_ = uVar148;
      local_4c0._28_4_ = uVar148;
      auVar157._8_4_ = 1;
      auVar157._0_8_ = 0x100000001;
      auVar157._12_4_ = 1;
      auVar157._16_4_ = 1;
      auVar157._20_4_ = 1;
      auVar157._24_4_ = 1;
      auVar157._28_4_ = 1;
      local_4e0 = vpermps_avx512vl(auVar157,ZEXT1632(auVar5));
      auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x484);
      local_5e0 = vbroadcastss_avx512vl(auVar6);
      local_200 = vpermps_avx512vl(auVar157,ZEXT1632(auVar6));
      auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar92);
      local_c0 = vpermps_avx512vl(auVar157,ZEXT1632(auVar92));
      auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0xd8c);
      local_e0 = vbroadcastss_avx512vl(auVar93);
      local_100 = vpermps_avx512vl(auVar157,ZEXT1632(auVar93));
      auVar108 = vmulps_avx512vl(local_e0,auVar116);
      auVar109 = vmulps_avx512vl(local_100,auVar116);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,local_a0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,local_c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar118,local_5e0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar118,local_200);
      auVar104 = vfmadd231ps_avx512vl(auVar108,auVar106,local_4c0);
      auVar110 = vfmadd231ps_avx512vl(auVar109,auVar106,local_4e0);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar70);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x484);
      auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x908);
      auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0xd8c);
      auVar103 = vmulps_avx512vl(local_e0,auVar114);
      auVar101 = vmulps_avx512vl(local_100,auVar114);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_a0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar115,local_c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_5e0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_200);
      auVar7 = vfmadd231ps_fma(auVar103,auVar108,local_4c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_4e0);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar7),auVar104);
      _local_660 = vsubps_avx(auVar101,auVar110);
      auVar103 = vmulps_avx512vl(auVar110,auVar102);
      auVar111 = vmulps_avx512vl(auVar104,_local_660);
      auVar103 = vsubps_avx512vl(auVar103,auVar111);
      auVar94 = vshufps_avx(local_470,local_470,0xff);
      uVar149 = auVar96._0_8_;
      local_120._8_8_ = uVar149;
      local_120._0_8_ = uVar149;
      local_120._16_8_ = uVar149;
      local_120._24_8_ = uVar149;
      local_140 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_480,local_480,0xff);
      local_160 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(local_490,local_490,0xff);
      uVar149 = auVar94._0_8_;
      register0x00001248 = uVar149;
      local_180 = uVar149;
      register0x00001250 = uVar149;
      register0x00001258 = uVar149;
      auVar111 = vmulps_avx512vl(_local_180,auVar116);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,local_160);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_140);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,local_120);
      auVar112 = vmulps_avx512vl(_local_180,auVar114);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_160);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,local_140);
      auVar8 = vfmadd231ps_fma(auVar112,auVar108,local_120);
      auVar112 = vmulps_avx512vl(_local_660,_local_660);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar102,auVar102);
      auVar113 = vmaxps_avx512vl(auVar111,ZEXT1632(auVar8));
      auVar113 = vmulps_avx512vl(auVar113,auVar113);
      auVar112 = vmulps_avx512vl(auVar113,auVar112);
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      uVar149 = vcmpps_avx512vl(auVar103,auVar112,2);
      auVar94 = vblendps_avx(auVar5,auVar20,8);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar96 = vandps_avx512vl(auVar94,auVar95);
      auVar94 = vblendps_avx(auVar6,local_470,8);
      auVar94 = vandps_avx512vl(auVar94,auVar95);
      auVar96 = vmaxps_avx(auVar96,auVar94);
      auVar94 = vblendps_avx(auVar92,local_480,8);
      auVar97 = vandps_avx512vl(auVar94,auVar95);
      auVar94 = vblendps_avx(auVar93,local_490,8);
      auVar94 = vandps_avx512vl(auVar94,auVar95);
      auVar94 = vmaxps_avx(auVar97,auVar94);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      auVar96 = vmovshdup_avx(auVar94);
      auVar96 = vmaxss_avx(auVar96,auVar94);
      auVar94 = vshufpd_avx(auVar94,auVar94,1);
      auVar94 = vmaxss_avx(auVar94,auVar96);
      local_5f0 = vcvtsi2ss_avx512f(local_490,iVar10);
      auVar188._0_4_ = local_5f0._0_4_;
      auVar188._4_4_ = auVar188._0_4_;
      auVar188._8_4_ = auVar188._0_4_;
      auVar188._12_4_ = auVar188._0_4_;
      auVar188._16_4_ = auVar188._0_4_;
      auVar188._20_4_ = auVar188._0_4_;
      auVar188._24_4_ = auVar188._0_4_;
      auVar188._28_4_ = auVar188._0_4_;
      uVar21 = vcmpps_avx512vl(auVar188,_DAT_02020f40,0xe);
      local_2d0 = (byte)uVar149 & (byte)uVar21;
      local_560 = auVar94._0_4_ * 4.7683716e-07;
      auVar163._8_4_ = 2;
      auVar163._0_8_ = 0x200000002;
      auVar163._12_4_ = 2;
      auVar163._16_4_ = 2;
      auVar163._20_4_ = 2;
      auVar163._24_4_ = 2;
      auVar163._28_4_ = 2;
      local_1a0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar5));
      local_1c0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar6));
      local_1e0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar92));
      auVar103 = vpermps_avx2(auVar163,ZEXT1632(auVar93));
      fVar166 = *(float *)(ray + k * 4 + 0x30);
      auVar94 = local_100._0_16_;
      local_640 = ZEXT416((uint)local_560);
      if (local_2d0 == 0) {
        bVar81 = false;
        auVar94 = vxorps_avx512vl(auVar94,auVar94);
        auVar200 = ZEXT1664(auVar94);
        auVar179 = ZEXT3264(auVar105);
        in_ZMM20 = ZEXT3264(local_500);
        auVar158 = ZEXT3264(auVar107);
        auVar198 = ZEXT3264(local_520);
        auVar199 = ZEXT3264(local_4c0);
        auVar197 = ZEXT3264(local_4e0);
        auVar196 = ZEXT3264(local_5e0);
      }
      else {
        fStack_55c = 0.0;
        fStack_558 = 0.0;
        fStack_554 = 0.0;
        auVar114 = vmulps_avx512vl(auVar103,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_1e0,auVar114);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_1c0,auVar115);
        auVar109 = vfmadd213ps_avx512vl(auVar108,local_1a0,auVar109);
        auVar116 = vmulps_avx512vl(auVar103,auVar116);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_1e0,auVar116);
        auVar115 = vfmadd213ps_avx512vl(auVar118,local_1c0,auVar117);
        auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1694);
        auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 + 0x1f9c);
        auVar115 = vfmadd213ps_avx512vl(auVar106,local_1a0,auVar115);
        auVar106 = vmulps_avx512vl(local_e0,auVar108);
        auVar114 = vmulps_avx512vl(local_100,auVar108);
        auVar32._4_4_ = auVar103._4_4_ * auVar108._4_4_;
        auVar32._0_4_ = auVar103._0_4_ * auVar108._0_4_;
        auVar32._8_4_ = auVar103._8_4_ * auVar108._8_4_;
        auVar32._12_4_ = auVar103._12_4_ * auVar108._12_4_;
        auVar32._16_4_ = auVar103._16_4_ * auVar108._16_4_;
        auVar32._20_4_ = auVar103._20_4_ * auVar108._20_4_;
        auVar32._24_4_ = auVar103._24_4_ * auVar108._24_4_;
        auVar32._28_4_ = auVar108._28_4_;
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,local_a0);
        auVar108 = vfmadd231ps_avx512vl(auVar114,auVar116,local_c0);
        auVar116 = vfmadd231ps_avx512vl(auVar32,local_1e0,auVar116);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,local_5e0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,local_200);
        auVar114 = vfmadd231ps_avx512vl(auVar116,local_1c0,auVar117);
        auVar112 = vfmadd231ps_avx512vl(auVar106,auVar118,local_4c0);
        auVar197 = ZEXT3264(local_4e0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar118,local_4e0);
        auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1f9c);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar118);
        auVar118 = vmulps_avx512vl(local_e0,auVar116);
        auVar113 = vmulps_avx512vl(local_100,auVar116);
        auVar33._4_4_ = auVar103._4_4_ * auVar116._4_4_;
        auVar33._0_4_ = auVar103._0_4_ * auVar116._0_4_;
        auVar33._8_4_ = auVar103._8_4_ * auVar116._8_4_;
        auVar33._12_4_ = auVar103._12_4_ * auVar116._12_4_;
        auVar33._16_4_ = auVar103._16_4_ * auVar116._16_4_;
        auVar33._20_4_ = auVar103._20_4_ * auVar116._20_4_;
        auVar33._24_4_ = auVar103._24_4_ * auVar116._24_4_;
        auVar33._28_4_ = auVar116._28_4_;
        auVar116 = vfmadd231ps_avx512vl(auVar118,auVar117,local_a0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar117,local_c0);
        auVar117 = vfmadd231ps_avx512vl(auVar33,local_1e0,auVar117);
        auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 + 0x1694);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,local_5e0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_200);
        auVar118 = vfmadd231ps_avx512vl(auVar117,local_1c0,auVar118);
        auVar117 = vfmadd231ps_avx512vl(auVar116,auVar106,local_4c0);
        auVar116 = vfmadd231ps_avx512vl(auVar113,auVar106,local_4e0);
        auVar113 = vfmadd231ps_avx512vl(auVar118,local_1a0,auVar106);
        auVar194._8_4_ = 0x7fffffff;
        auVar194._0_8_ = 0x7fffffff7fffffff;
        auVar194._12_4_ = 0x7fffffff;
        auVar194._16_4_ = 0x7fffffff;
        auVar194._20_4_ = 0x7fffffff;
        auVar194._24_4_ = 0x7fffffff;
        auVar194._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar112,auVar194);
        auVar118 = vandps_avx(auVar108,auVar194);
        auVar118 = vmaxps_avx(auVar106,auVar118);
        auVar106 = vandps_avx(auVar114,auVar194);
        auVar106 = vmaxps_avx(auVar118,auVar106);
        auVar114 = vbroadcastss_avx512vl(local_640);
        uVar90 = vcmpps_avx512vl(auVar106,auVar114,1);
        bVar81 = (bool)((byte)uVar90 & 1);
        auVar119._0_4_ = (float)((uint)bVar81 * auVar102._0_4_ | (uint)!bVar81 * auVar112._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar81 * auVar102._4_4_ | (uint)!bVar81 * auVar112._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar81 * auVar102._8_4_ | (uint)!bVar81 * auVar112._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar81 * auVar102._12_4_ | (uint)!bVar81 * auVar112._12_4_);
        bVar81 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar81 * auVar102._16_4_ | (uint)!bVar81 * auVar112._16_4_);
        bVar81 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar81 * auVar102._20_4_ | (uint)!bVar81 * auVar112._20_4_);
        bVar81 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar81 * auVar102._24_4_ | (uint)!bVar81 * auVar112._24_4_);
        bVar81 = SUB81(uVar90 >> 7,0);
        auVar119._28_4_ = (uint)bVar81 * auVar102._28_4_ | (uint)!bVar81 * auVar112._28_4_;
        bVar81 = (bool)((byte)uVar90 & 1);
        auVar120._0_4_ = (float)((uint)bVar81 * local_660._0_4_ | (uint)!bVar81 * auVar108._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar81 * local_660._4_4_ | (uint)!bVar81 * auVar108._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar81 * iStack_658 | (uint)!bVar81 * auVar108._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar81 * iStack_654 | (uint)!bVar81 * auVar108._12_4_);
        bVar81 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar81 * iStack_650 | (uint)!bVar81 * auVar108._16_4_);
        bVar81 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar81 * iStack_64c | (uint)!bVar81 * auVar108._20_4_);
        bVar81 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar81 * iStack_648 | (uint)!bVar81 * auVar108._24_4_);
        bVar81 = SUB81(uVar90 >> 7,0);
        auVar120._28_4_ = (uint)bVar81 * iStack_644 | (uint)!bVar81 * auVar108._28_4_;
        auVar106 = vandps_avx(auVar194,auVar117);
        auVar118 = vandps_avx(auVar116,auVar194);
        auVar118 = vmaxps_avx(auVar106,auVar118);
        auVar106 = vandps_avx(auVar113,auVar194);
        auVar106 = vmaxps_avx(auVar118,auVar106);
        uVar90 = vcmpps_avx512vl(auVar106,auVar114,1);
        bVar81 = (bool)((byte)uVar90 & 1);
        auVar121._0_4_ = (float)((uint)bVar81 * auVar102._0_4_ | (uint)!bVar81 * auVar117._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar81 * auVar102._4_4_ | (uint)!bVar81 * auVar117._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar81 * auVar102._8_4_ | (uint)!bVar81 * auVar117._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar81 * auVar102._12_4_ | (uint)!bVar81 * auVar117._12_4_);
        bVar81 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar81 * auVar102._16_4_ | (uint)!bVar81 * auVar117._16_4_);
        bVar81 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar81 * auVar102._20_4_ | (uint)!bVar81 * auVar117._20_4_);
        bVar81 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar81 * auVar102._24_4_ | (uint)!bVar81 * auVar117._24_4_);
        bVar81 = SUB81(uVar90 >> 7,0);
        auVar121._28_4_ = (uint)bVar81 * auVar102._28_4_ | (uint)!bVar81 * auVar117._28_4_;
        bVar81 = (bool)((byte)uVar90 & 1);
        auVar122._0_4_ = (float)((uint)bVar81 * local_660._0_4_ | (uint)!bVar81 * auVar116._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar81 * local_660._4_4_ | (uint)!bVar81 * auVar116._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar81 * iStack_658 | (uint)!bVar81 * auVar116._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar81 * iStack_654 | (uint)!bVar81 * auVar116._12_4_);
        bVar81 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar81 * iStack_650 | (uint)!bVar81 * auVar116._16_4_);
        bVar81 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar81 * iStack_64c | (uint)!bVar81 * auVar116._20_4_);
        bVar81 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar81 * iStack_648 | (uint)!bVar81 * auVar116._24_4_);
        bVar81 = SUB81(uVar90 >> 7,0);
        auVar122._28_4_ = (uint)bVar81 * iStack_644 | (uint)!bVar81 * auVar116._28_4_;
        auVar98 = vxorps_avx512vl(auVar94,auVar94);
        auVar200 = ZEXT1664(auVar98);
        auVar106 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar98));
        auVar94 = vfmadd231ps_fma(auVar106,auVar120,auVar120);
        auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar147 = auVar106._0_4_;
        fVar175 = auVar106._4_4_;
        fVar176 = auVar106._8_4_;
        fVar177 = auVar106._12_4_;
        fVar160 = auVar106._16_4_;
        fVar165 = auVar106._20_4_;
        fVar91 = auVar106._24_4_;
        auVar34._4_4_ = fVar175 * fVar175 * fVar175 * auVar94._4_4_ * -0.5;
        auVar34._0_4_ = fVar147 * fVar147 * fVar147 * auVar94._0_4_ * -0.5;
        auVar34._8_4_ = fVar176 * fVar176 * fVar176 * auVar94._8_4_ * -0.5;
        auVar34._12_4_ = fVar177 * fVar177 * fVar177 * auVar94._12_4_ * -0.5;
        auVar34._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar34._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar34._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar34._28_4_ = 0;
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar117 = vfmadd231ps_avx512vl(auVar34,auVar118,auVar106);
        auVar35._4_4_ = auVar120._4_4_ * auVar117._4_4_;
        auVar35._0_4_ = auVar120._0_4_ * auVar117._0_4_;
        auVar35._8_4_ = auVar120._8_4_ * auVar117._8_4_;
        auVar35._12_4_ = auVar120._12_4_ * auVar117._12_4_;
        auVar35._16_4_ = auVar120._16_4_ * auVar117._16_4_;
        auVar35._20_4_ = auVar120._20_4_ * auVar117._20_4_;
        auVar35._24_4_ = auVar120._24_4_ * auVar117._24_4_;
        auVar35._28_4_ = auVar106._28_4_;
        auVar36._4_4_ = auVar117._4_4_ * -auVar119._4_4_;
        auVar36._0_4_ = auVar117._0_4_ * -auVar119._0_4_;
        auVar36._8_4_ = auVar117._8_4_ * -auVar119._8_4_;
        auVar36._12_4_ = auVar117._12_4_ * -auVar119._12_4_;
        auVar36._16_4_ = auVar117._16_4_ * -auVar119._16_4_;
        auVar36._20_4_ = auVar117._20_4_ * -auVar119._20_4_;
        auVar36._24_4_ = auVar117._24_4_ * -auVar119._24_4_;
        auVar36._28_4_ = auVar119._28_4_ ^ 0x80000000;
        auVar106 = vmulps_avx512vl(auVar117,ZEXT1632(auVar98));
        auVar102 = ZEXT1632(auVar98);
        auVar116 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar102);
        auVar94 = vfmadd231ps_fma(auVar116,auVar122,auVar122);
        auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar147 = auVar116._0_4_;
        fVar175 = auVar116._4_4_;
        fVar176 = auVar116._8_4_;
        fVar177 = auVar116._12_4_;
        fVar160 = auVar116._16_4_;
        fVar165 = auVar116._20_4_;
        fVar91 = auVar116._24_4_;
        auVar37._4_4_ = fVar175 * fVar175 * fVar175 * auVar94._4_4_ * -0.5;
        auVar37._0_4_ = fVar147 * fVar147 * fVar147 * auVar94._0_4_ * -0.5;
        auVar37._8_4_ = fVar176 * fVar176 * fVar176 * auVar94._8_4_ * -0.5;
        auVar37._12_4_ = fVar177 * fVar177 * fVar177 * auVar94._12_4_ * -0.5;
        auVar37._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar37._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar37._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar37._28_4_ = 0;
        auVar118 = vfmadd231ps_avx512vl(auVar37,auVar118,auVar116);
        auVar38._4_4_ = auVar122._4_4_ * auVar118._4_4_;
        auVar38._0_4_ = auVar122._0_4_ * auVar118._0_4_;
        auVar38._8_4_ = auVar122._8_4_ * auVar118._8_4_;
        auVar38._12_4_ = auVar122._12_4_ * auVar118._12_4_;
        auVar38._16_4_ = auVar122._16_4_ * auVar118._16_4_;
        auVar38._20_4_ = auVar122._20_4_ * auVar118._20_4_;
        auVar38._24_4_ = auVar122._24_4_ * auVar118._24_4_;
        auVar38._28_4_ = auVar116._28_4_;
        auVar39._4_4_ = -auVar121._4_4_ * auVar118._4_4_;
        auVar39._0_4_ = -auVar121._0_4_ * auVar118._0_4_;
        auVar39._8_4_ = -auVar121._8_4_ * auVar118._8_4_;
        auVar39._12_4_ = -auVar121._12_4_ * auVar118._12_4_;
        auVar39._16_4_ = -auVar121._16_4_ * auVar118._16_4_;
        auVar39._20_4_ = -auVar121._20_4_ * auVar118._20_4_;
        auVar39._24_4_ = -auVar121._24_4_ * auVar118._24_4_;
        auVar39._28_4_ = auVar117._28_4_;
        auVar118 = vmulps_avx512vl(auVar118,auVar102);
        auVar94 = vfmadd213ps_fma(auVar35,auVar111,auVar104);
        auVar96 = vfmadd213ps_fma(auVar36,auVar111,auVar110);
        auVar117 = vfmadd213ps_avx512vl(auVar106,auVar111,auVar115);
        auVar116 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar8),ZEXT1632(auVar7));
        auVar95 = vfnmadd213ps_fma(auVar35,auVar111,auVar104);
        auVar114 = ZEXT1632(auVar8);
        auVar93 = vfmadd213ps_fma(auVar39,auVar114,auVar101);
        auVar97 = vfnmadd213ps_fma(auVar36,auVar111,auVar110);
        auVar92 = vfmadd213ps_fma(auVar118,auVar114,auVar109);
        auVar108 = vfnmadd231ps_avx512vl(auVar115,auVar111,auVar106);
        auVar7 = vfnmadd213ps_fma(auVar38,auVar114,ZEXT1632(auVar7));
        auVar161 = vfnmadd213ps_fma(auVar39,auVar114,auVar101);
        auVar162 = vfnmadd231ps_fma(auVar109,ZEXT1632(auVar8),auVar118);
        auVar118 = vsubps_avx512vl(auVar116,ZEXT1632(auVar95));
        auVar106 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar97));
        auVar109 = vsubps_avx512vl(ZEXT1632(auVar92),auVar108);
        auVar115 = vmulps_avx512vl(auVar106,auVar108);
        auVar5 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar97),auVar109);
        auVar40._4_4_ = auVar95._4_4_ * auVar109._4_4_;
        auVar40._0_4_ = auVar95._0_4_ * auVar109._0_4_;
        auVar40._8_4_ = auVar95._8_4_ * auVar109._8_4_;
        auVar40._12_4_ = auVar95._12_4_ * auVar109._12_4_;
        auVar40._16_4_ = auVar109._16_4_ * 0.0;
        auVar40._20_4_ = auVar109._20_4_ * 0.0;
        auVar40._24_4_ = auVar109._24_4_ * 0.0;
        auVar40._28_4_ = auVar109._28_4_;
        auVar109 = vfmsub231ps_avx512vl(auVar40,auVar108,auVar118);
        auVar41._4_4_ = auVar97._4_4_ * auVar118._4_4_;
        auVar41._0_4_ = auVar97._0_4_ * auVar118._0_4_;
        auVar41._8_4_ = auVar97._8_4_ * auVar118._8_4_;
        auVar41._12_4_ = auVar97._12_4_ * auVar118._12_4_;
        auVar41._16_4_ = auVar118._16_4_ * 0.0;
        auVar41._20_4_ = auVar118._20_4_ * 0.0;
        auVar41._24_4_ = auVar118._24_4_ * 0.0;
        auVar41._28_4_ = auVar118._28_4_;
        auVar6 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar95),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar6),auVar102,auVar109);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar5));
        auVar102 = ZEXT1632(auVar98);
        uVar90 = vcmpps_avx512vl(auVar106,auVar102,2);
        bVar84 = (byte)uVar90;
        fVar91 = (float)((uint)(bVar84 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar7._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        fVar139 = (float)((uint)bVar81 * auVar94._4_4_ | (uint)!bVar81 * auVar7._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        fVar141 = (float)((uint)bVar81 * auVar94._8_4_ | (uint)!bVar81 * auVar7._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        fVar143 = (float)((uint)bVar81 * auVar94._12_4_ | (uint)!bVar81 * auVar7._12_4_);
        auVar115 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar91))));
        fVar159 = (float)((uint)(bVar84 & 1) * auVar96._0_4_ |
                         (uint)!(bool)(bVar84 & 1) * auVar161._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        fVar140 = (float)((uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * auVar161._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        fVar142 = (float)((uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * auVar161._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        fVar144 = (float)((uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * auVar161._12_4_);
        auVar114 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar159))));
        auVar123._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar117._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar162._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar81 * auVar117._4_4_ | (uint)!bVar81 * auVar162._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar81 * auVar117._8_4_ | (uint)!bVar81 * auVar162._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar81 * auVar117._12_4_ | (uint)!bVar81 * auVar162._12_4_);
        fVar147 = (float)((uint)((byte)(uVar90 >> 4) & 1) * auVar117._16_4_);
        auVar123._16_4_ = fVar147;
        fVar175 = (float)((uint)((byte)(uVar90 >> 5) & 1) * auVar117._20_4_);
        auVar123._20_4_ = fVar175;
        fVar176 = (float)((uint)((byte)(uVar90 >> 6) & 1) * auVar117._24_4_);
        auVar123._24_4_ = fVar176;
        iVar1 = (uint)(byte)(uVar90 >> 7) * auVar117._28_4_;
        auVar123._28_4_ = iVar1;
        auVar118 = vblendmps_avx512vl(ZEXT1632(auVar95),auVar116);
        auVar124._0_4_ =
             (uint)(bVar84 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar5._0_4_;
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar81 * auVar118._4_4_ | (uint)!bVar81 * auVar5._4_4_;
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar81 * auVar118._8_4_ | (uint)!bVar81 * auVar5._8_4_;
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar81 * auVar118._12_4_ | (uint)!bVar81 * auVar5._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar118._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar118._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar118._24_4_;
        auVar124._28_4_ = (uint)(byte)(uVar90 >> 7) * auVar118._28_4_;
        auVar118 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar93));
        auVar125._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar96._0_4_
                    );
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar81 * auVar118._4_4_ | (uint)!bVar81 * auVar96._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar81 * auVar118._8_4_ | (uint)!bVar81 * auVar96._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar81 * auVar118._12_4_ | (uint)!bVar81 * auVar96._12_4_);
        fVar177 = (float)((uint)((byte)(uVar90 >> 4) & 1) * auVar118._16_4_);
        auVar125._16_4_ = fVar177;
        fVar160 = (float)((uint)((byte)(uVar90 >> 5) & 1) * auVar118._20_4_);
        auVar125._20_4_ = fVar160;
        fVar165 = (float)((uint)((byte)(uVar90 >> 6) & 1) * auVar118._24_4_);
        auVar125._24_4_ = fVar165;
        auVar125._28_4_ = (uint)(byte)(uVar90 >> 7) * auVar118._28_4_;
        auVar118 = vblendmps_avx512vl(auVar108,ZEXT1632(auVar92));
        auVar126._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar118._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar117._0_4_);
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar81 * auVar118._4_4_ | (uint)!bVar81 * auVar117._4_4_);
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar81 * auVar118._8_4_ | (uint)!bVar81 * auVar117._8_4_);
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar81 * auVar118._12_4_ | (uint)!bVar81 * auVar117._12_4_);
        bVar81 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar81 * auVar118._16_4_ | (uint)!bVar81 * auVar117._16_4_);
        bVar81 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar81 * auVar118._20_4_ | (uint)!bVar81 * auVar117._20_4_);
        bVar81 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar81 * auVar118._24_4_ | (uint)!bVar81 * auVar117._24_4_);
        bVar81 = SUB81(uVar90 >> 7,0);
        auVar126._28_4_ = (uint)bVar81 * auVar118._28_4_ | (uint)!bVar81 * auVar117._28_4_;
        auVar127._0_4_ =
             (uint)(bVar84 & 1) * (int)auVar95._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar116._0_4_;
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar81 * (int)auVar95._4_4_ | (uint)!bVar81 * auVar116._4_4_;
        bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar81 * (int)auVar95._8_4_ | (uint)!bVar81 * auVar116._8_4_;
        bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar81 * (int)auVar95._12_4_ | (uint)!bVar81 * auVar116._12_4_;
        auVar127._16_4_ = (uint)!(bool)((byte)(uVar90 >> 4) & 1) * auVar116._16_4_;
        auVar127._20_4_ = (uint)!(bool)((byte)(uVar90 >> 5) & 1) * auVar116._20_4_;
        auVar127._24_4_ = (uint)!(bool)((byte)(uVar90 >> 6) & 1) * auVar116._24_4_;
        auVar127._28_4_ = (uint)!SUB81(uVar90 >> 7,0) * auVar116._28_4_;
        bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar90 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar128._0_4_ =
             (uint)(bVar84 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar92._0_4_;
        bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar92._4_4_;
        bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar92._8_4_;
        bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar92._12_4_;
        auVar128._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar108._16_4_;
        auVar128._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar108._20_4_;
        auVar128._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar108._24_4_;
        iVar2 = (uint)(byte)(uVar90 >> 7) * auVar108._28_4_;
        auVar128._28_4_ = iVar2;
        auVar104 = vsubps_avx512vl(auVar127,auVar115);
        auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar97._12_4_ |
                                                 (uint)!bVar15 * auVar93._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar97._8_4_ |
                                                          (uint)!bVar14 * auVar93._8_4_,
                                                          CONCAT44((uint)bVar81 * (int)auVar97._4_4_
                                                                   | (uint)!bVar81 * auVar93._4_4_,
                                                                   (uint)(bVar84 & 1) *
                                                                   (int)auVar97._0_4_ |
                                                                   (uint)!(bool)(bVar84 & 1) *
                                                                   auVar93._0_4_)))),auVar114);
        auVar117 = vsubps_avx(auVar128,auVar123);
        auVar116 = vsubps_avx(auVar115,auVar124);
        auVar108 = vsubps_avx(auVar114,auVar125);
        auVar109 = vsubps_avx(auVar123,auVar126);
        auVar42._4_4_ = auVar117._4_4_ * fVar139;
        auVar42._0_4_ = auVar117._0_4_ * fVar91;
        auVar42._8_4_ = auVar117._8_4_ * fVar141;
        auVar42._12_4_ = auVar117._12_4_ * fVar143;
        auVar42._16_4_ = auVar117._16_4_ * 0.0;
        auVar42._20_4_ = auVar117._20_4_ * 0.0;
        auVar42._24_4_ = auVar117._24_4_ * 0.0;
        auVar42._28_4_ = iVar2;
        auVar94 = vfmsub231ps_fma(auVar42,auVar123,auVar104);
        auVar43._4_4_ = fVar140 * auVar104._4_4_;
        auVar43._0_4_ = fVar159 * auVar104._0_4_;
        auVar43._8_4_ = fVar142 * auVar104._8_4_;
        auVar43._12_4_ = fVar144 * auVar104._12_4_;
        auVar43._16_4_ = auVar104._16_4_ * 0.0;
        auVar43._20_4_ = auVar104._20_4_ * 0.0;
        auVar43._24_4_ = auVar104._24_4_ * 0.0;
        auVar43._28_4_ = auVar106._28_4_;
        auVar96 = vfmsub231ps_fma(auVar43,auVar115,auVar118);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar102,ZEXT1632(auVar94));
        auVar171._0_4_ = auVar118._0_4_ * auVar123._0_4_;
        auVar171._4_4_ = auVar118._4_4_ * auVar123._4_4_;
        auVar171._8_4_ = auVar118._8_4_ * auVar123._8_4_;
        auVar171._12_4_ = auVar118._12_4_ * auVar123._12_4_;
        auVar171._16_4_ = auVar118._16_4_ * fVar147;
        auVar171._20_4_ = auVar118._20_4_ * fVar175;
        auVar171._24_4_ = auVar118._24_4_ * fVar176;
        auVar171._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar171,auVar114,auVar117);
        auVar110 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar94));
        auVar106 = vmulps_avx512vl(auVar109,auVar124);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar116,auVar126);
        auVar44._4_4_ = auVar108._4_4_ * auVar126._4_4_;
        auVar44._0_4_ = auVar108._0_4_ * auVar126._0_4_;
        auVar44._8_4_ = auVar108._8_4_ * auVar126._8_4_;
        auVar44._12_4_ = auVar108._12_4_ * auVar126._12_4_;
        auVar44._16_4_ = auVar108._16_4_ * auVar126._16_4_;
        auVar44._20_4_ = auVar108._20_4_ * auVar126._20_4_;
        auVar44._24_4_ = auVar108._24_4_ * auVar126._24_4_;
        auVar44._28_4_ = auVar126._28_4_;
        auVar94 = vfmsub231ps_fma(auVar44,auVar125,auVar109);
        auVar172._0_4_ = auVar125._0_4_ * auVar116._0_4_;
        auVar172._4_4_ = auVar125._4_4_ * auVar116._4_4_;
        auVar172._8_4_ = auVar125._8_4_ * auVar116._8_4_;
        auVar172._12_4_ = auVar125._12_4_ * auVar116._12_4_;
        auVar172._16_4_ = fVar177 * auVar116._16_4_;
        auVar172._20_4_ = fVar160 * auVar116._20_4_;
        auVar172._24_4_ = fVar165 * auVar116._24_4_;
        auVar172._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar172,auVar108,auVar124);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar102,auVar106);
        auVar101 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar94));
        auVar106 = vmaxps_avx(auVar110,auVar101);
        uVar149 = vcmpps_avx512vl(auVar106,auVar102,2);
        local_2d0 = local_2d0 & (byte)uVar149;
        in_ZMM20 = ZEXT3264(local_500);
        auVar199 = ZEXT3264(local_4c0);
        auVar196 = ZEXT3264(local_5e0);
        auVar192 = ZEXT1664(local_640);
        if (local_2d0 == 0) {
          local_2d0 = 0;
          auVar179 = ZEXT3264(auVar105);
          auVar158 = ZEXT3264(auVar107);
        }
        else {
          auVar45._4_4_ = auVar109._4_4_ * auVar118._4_4_;
          auVar45._0_4_ = auVar109._0_4_ * auVar118._0_4_;
          auVar45._8_4_ = auVar109._8_4_ * auVar118._8_4_;
          auVar45._12_4_ = auVar109._12_4_ * auVar118._12_4_;
          auVar45._16_4_ = auVar109._16_4_ * auVar118._16_4_;
          auVar45._20_4_ = auVar109._20_4_ * auVar118._20_4_;
          auVar45._24_4_ = auVar109._24_4_ * auVar118._24_4_;
          auVar45._28_4_ = auVar106._28_4_;
          auVar93 = vfmsub231ps_fma(auVar45,auVar108,auVar117);
          auVar46._4_4_ = auVar117._4_4_ * auVar116._4_4_;
          auVar46._0_4_ = auVar117._0_4_ * auVar116._0_4_;
          auVar46._8_4_ = auVar117._8_4_ * auVar116._8_4_;
          auVar46._12_4_ = auVar117._12_4_ * auVar116._12_4_;
          auVar46._16_4_ = auVar117._16_4_ * auVar116._16_4_;
          auVar46._20_4_ = auVar117._20_4_ * auVar116._20_4_;
          auVar46._24_4_ = auVar117._24_4_ * auVar116._24_4_;
          auVar46._28_4_ = auVar117._28_4_;
          auVar96 = vfmsub231ps_fma(auVar46,auVar104,auVar109);
          auVar47._4_4_ = auVar108._4_4_ * auVar104._4_4_;
          auVar47._0_4_ = auVar108._0_4_ * auVar104._0_4_;
          auVar47._8_4_ = auVar108._8_4_ * auVar104._8_4_;
          auVar47._12_4_ = auVar108._12_4_ * auVar104._12_4_;
          auVar47._16_4_ = auVar108._16_4_ * auVar104._16_4_;
          auVar47._20_4_ = auVar108._20_4_ * auVar104._20_4_;
          auVar47._24_4_ = auVar108._24_4_ * auVar104._24_4_;
          auVar47._28_4_ = auVar108._28_4_;
          auVar92 = vfmsub231ps_fma(auVar47,auVar116,auVar118);
          auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar92));
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar93),auVar102);
          auVar118 = vrcp14ps_avx512vl(auVar106);
          auVar189._8_4_ = 0x3f800000;
          auVar189._0_8_ = &DAT_3f8000003f800000;
          auVar189._12_4_ = 0x3f800000;
          auVar189._16_4_ = 0x3f800000;
          auVar189._20_4_ = 0x3f800000;
          auVar189._24_4_ = 0x3f800000;
          auVar189._28_4_ = 0x3f800000;
          auVar94 = vfnmadd213ps_fma(auVar118,auVar106,auVar189);
          auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar118,auVar118);
          auVar48._4_4_ = auVar92._4_4_ * auVar123._4_4_;
          auVar48._0_4_ = auVar92._0_4_ * auVar123._0_4_;
          auVar48._8_4_ = auVar92._8_4_ * auVar123._8_4_;
          auVar48._12_4_ = auVar92._12_4_ * auVar123._12_4_;
          auVar48._16_4_ = fVar147 * 0.0;
          auVar48._20_4_ = fVar175 * 0.0;
          auVar48._24_4_ = fVar176 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar96 = vfmadd231ps_fma(auVar48,auVar114,ZEXT1632(auVar96));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar115,ZEXT1632(auVar93));
          fVar147 = auVar94._0_4_;
          fVar175 = auVar94._4_4_;
          fVar176 = auVar94._8_4_;
          fVar177 = auVar94._12_4_;
          auVar118 = ZEXT1632(CONCAT412(auVar96._12_4_ * fVar177,
                                        CONCAT48(auVar96._8_4_ * fVar176,
                                                 CONCAT44(auVar96._4_4_ * fVar175,
                                                          auVar96._0_4_ * fVar147))));
          auVar158 = ZEXT3264(auVar118);
          auVar182._4_4_ = fVar166;
          auVar182._0_4_ = fVar166;
          auVar182._8_4_ = fVar166;
          auVar182._12_4_ = fVar166;
          auVar182._16_4_ = fVar166;
          auVar182._20_4_ = fVar166;
          auVar182._24_4_ = fVar166;
          auVar182._28_4_ = fVar166;
          uVar149 = vcmpps_avx512vl(auVar182,auVar118,2);
          uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar24._4_4_ = uVar148;
          auVar24._0_4_ = uVar148;
          auVar24._8_4_ = uVar148;
          auVar24._12_4_ = uVar148;
          auVar24._16_4_ = uVar148;
          auVar24._20_4_ = uVar148;
          auVar24._24_4_ = uVar148;
          auVar24._28_4_ = uVar148;
          uVar21 = vcmpps_avx512vl(auVar118,auVar24,2);
          local_2d0 = (byte)uVar149 & (byte)uVar21 & local_2d0;
          if (local_2d0 == 0) {
            local_2d0 = 0;
            auVar179 = ZEXT3264(auVar105);
            auVar158 = ZEXT3264(auVar107);
          }
          else {
            uVar149 = vcmpps_avx512vl(auVar106,auVar102,4);
            if ((local_2d0 & (byte)uVar149) == 0) {
              local_2d0 = 0;
              auVar179 = ZEXT3264(auVar105);
              auVar158 = ZEXT3264(auVar107);
            }
            else {
              local_2d0 = local_2d0 & (byte)uVar149;
              fVar160 = auVar110._0_4_ * fVar147;
              fVar165 = auVar110._4_4_ * fVar175;
              auVar49._4_4_ = fVar165;
              auVar49._0_4_ = fVar160;
              fVar91 = auVar110._8_4_ * fVar176;
              auVar49._8_4_ = fVar91;
              fVar159 = auVar110._12_4_ * fVar177;
              auVar49._12_4_ = fVar159;
              fVar139 = auVar110._16_4_ * 0.0;
              auVar49._16_4_ = fVar139;
              fVar140 = auVar110._20_4_ * 0.0;
              auVar49._20_4_ = fVar140;
              fVar141 = auVar110._24_4_ * 0.0;
              auVar49._24_4_ = fVar141;
              auVar49._28_4_ = auVar110._28_4_;
              fVar147 = auVar101._0_4_ * fVar147;
              fVar175 = auVar101._4_4_ * fVar175;
              auVar50._4_4_ = fVar175;
              auVar50._0_4_ = fVar147;
              fVar176 = auVar101._8_4_ * fVar176;
              auVar50._8_4_ = fVar176;
              fVar177 = auVar101._12_4_ * fVar177;
              auVar50._12_4_ = fVar177;
              fVar142 = auVar101._16_4_ * 0.0;
              auVar50._16_4_ = fVar142;
              fVar143 = auVar101._20_4_ * 0.0;
              auVar50._20_4_ = fVar143;
              fVar144 = auVar101._24_4_ * 0.0;
              auVar50._24_4_ = fVar144;
              auVar50._28_4_ = auVar101._28_4_;
              auVar107 = vsubps_avx(auVar189,auVar49);
              bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar90 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar90 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar90 >> 6) & 1);
              bVar18 = SUB81(uVar90 >> 7,0);
              auVar179 = ZEXT3264(CONCAT428((uint)bVar18 * auVar110._28_4_ |
                                            (uint)!bVar18 * auVar107._28_4_,
                                            CONCAT424((uint)bVar17 * (int)fVar141 |
                                                      (uint)!bVar17 * auVar107._24_4_,
                                                      CONCAT420((uint)bVar16 * (int)fVar140 |
                                                                (uint)!bVar16 * auVar107._20_4_,
                                                                CONCAT416((uint)bVar15 *
                                                                          (int)fVar139 |
                                                                          (uint)!bVar15 *
                                                                          auVar107._16_4_,
                                                                          CONCAT412((uint)bVar14 *
                                                                                    (int)fVar159 |
                                                                                    (uint)!bVar14 *
                                                                                    auVar107._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar13 * (int)fVar91 |
                                                  (uint)!bVar13 * auVar107._8_4_,
                                                  CONCAT44((uint)bVar81 * (int)fVar165 |
                                                           (uint)!bVar81 * auVar107._4_4_,
                                                           (uint)(bVar84 & 1) * (int)fVar160 |
                                                           (uint)!(bool)(bVar84 & 1) *
                                                           auVar107._0_4_))))))));
              auVar107 = vsubps_avx(auVar189,auVar50);
              local_240._0_4_ =
                   (uint)(bVar84 & 1) * (int)fVar147 | (uint)!(bool)(bVar84 & 1) * auVar107._0_4_;
              bVar81 = (bool)((byte)(uVar90 >> 1) & 1);
              local_240._4_4_ = (uint)bVar81 * (int)fVar175 | (uint)!bVar81 * auVar107._4_4_;
              bVar81 = (bool)((byte)(uVar90 >> 2) & 1);
              local_240._8_4_ = (uint)bVar81 * (int)fVar176 | (uint)!bVar81 * auVar107._8_4_;
              bVar81 = (bool)((byte)(uVar90 >> 3) & 1);
              local_240._12_4_ = (uint)bVar81 * (int)fVar177 | (uint)!bVar81 * auVar107._12_4_;
              bVar81 = (bool)((byte)(uVar90 >> 4) & 1);
              local_240._16_4_ = (uint)bVar81 * (int)fVar142 | (uint)!bVar81 * auVar107._16_4_;
              bVar81 = (bool)((byte)(uVar90 >> 5) & 1);
              local_240._20_4_ = (uint)bVar81 * (int)fVar143 | (uint)!bVar81 * auVar107._20_4_;
              bVar81 = (bool)((byte)(uVar90 >> 6) & 1);
              local_240._24_4_ = (uint)bVar81 * (int)fVar144 | (uint)!bVar81 * auVar107._24_4_;
              bVar81 = SUB81(uVar90 >> 7,0);
              local_240._28_4_ = (uint)bVar81 * auVar101._28_4_ | (uint)!bVar81 * auVar107._28_4_;
            }
          }
        }
        auVar183 = ZEXT3264(auVar103);
        auVar198 = ZEXT3264(local_520);
        if (local_2d0 == 0) {
          bVar81 = false;
        }
        else {
          auVar107 = vsubps_avx(ZEXT1632(auVar8),auVar111);
          auVar106 = auVar179._0_32_;
          auVar94 = vfmadd213ps_fma(auVar107,auVar106,auVar111);
          uVar148 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
          auVar25._4_4_ = uVar148;
          auVar25._0_4_ = uVar148;
          auVar25._8_4_ = uVar148;
          auVar25._12_4_ = uVar148;
          auVar25._16_4_ = uVar148;
          auVar25._20_4_ = uVar148;
          auVar25._24_4_ = uVar148;
          auVar25._28_4_ = uVar148;
          auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                        CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                 CONCAT44(auVar94._4_4_ +
                                                                          auVar94._4_4_,
                                                                          auVar94._0_4_ +
                                                                          auVar94._0_4_)))),auVar25)
          ;
          auVar105 = auVar158._0_32_;
          uVar149 = vcmpps_avx512vl(auVar105,auVar107,6);
          local_2d0 = local_2d0 & (byte)uVar149;
          if (local_2d0 == 0) {
            bVar81 = false;
          }
          else {
            local_660._0_4_ = *(undefined4 *)(prim + lVar86 * 4 + 6);
            auVar154._8_4_ = 0xbf800000;
            auVar154._0_8_ = 0xbf800000bf800000;
            auVar154._12_4_ = 0xbf800000;
            auVar154._16_4_ = 0xbf800000;
            auVar154._20_4_ = 0xbf800000;
            auVar154._24_4_ = 0xbf800000;
            auVar154._28_4_ = 0xbf800000;
            auVar26._8_4_ = 0x40000000;
            auVar26._0_8_ = 0x4000000040000000;
            auVar26._12_4_ = 0x40000000;
            auVar26._16_4_ = 0x40000000;
            auVar26._20_4_ = 0x40000000;
            auVar26._24_4_ = 0x40000000;
            auVar26._28_4_ = 0x40000000;
            local_360 = vfmadd132ps_avx512vl(local_240,auVar154,auVar26);
            local_240 = local_360;
            auVar107 = local_240;
            local_320 = 0;
            local_300 = local_470._0_8_;
            uStack_2f8 = local_470._8_8_;
            local_2f0 = local_480._0_8_;
            uStack_2e8 = local_480._8_8_;
            local_2e0 = local_490._0_8_;
            uStack_2d8 = local_490._8_8_;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar81 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar81 = true, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar147 = 1.0 / auVar188._0_4_;
              local_2c0[0] = fVar147 * (auVar179._0_4_ + 0.0);
              local_2c0[1] = fVar147 * (auVar179._4_4_ + 1.0);
              local_2c0[2] = fVar147 * (auVar179._8_4_ + 2.0);
              local_2c0[3] = fVar147 * (auVar179._12_4_ + 3.0);
              fStack_2b0 = fVar147 * (auVar179._16_4_ + 4.0);
              fStack_2ac = fVar147 * (auVar179._20_4_ + 5.0);
              fStack_2a8 = fVar147 * (auVar179._24_4_ + 6.0);
              fStack_2a4 = auVar179._28_4_ + 7.0;
              local_240._0_8_ = local_360._0_8_;
              local_240._8_8_ = local_360._8_8_;
              local_240._16_8_ = local_360._16_8_;
              local_240._24_8_ = local_360._24_8_;
              local_2a0 = local_240._0_8_;
              uStack_298 = local_240._8_8_;
              uStack_290 = local_240._16_8_;
              uStack_288 = local_240._24_8_;
              local_280 = auVar105;
              lVar86 = 0;
              uVar83 = (ulong)local_2d0;
              for (uVar90 = uVar83; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
                lVar86 = lVar86 + 1;
              }
              local_600 = vpbroadcastd_avx512vl();
              local_620 = vpbroadcastd_avx512vl();
              local_630 = local_480._0_4_;
              uStack_62c = local_480._4_4_;
              uStack_628 = local_480._8_8_;
              local_590 = local_490._0_4_;
              fStack_58c = local_490._4_4_;
              fStack_588 = local_490._8_4_;
              fStack_584 = local_490._12_4_;
              bVar81 = true;
              local_610 = local_470;
              local_5c0 = auVar103;
              local_560 = fVar166;
              local_380 = auVar106;
              local_340 = auVar105;
              local_31c = iVar10;
              local_310 = auVar20;
              local_240 = auVar107;
              do {
                auVar92 = auVar200._0_16_;
                local_440 = (undefined4)uVar83;
                uStack_43c = (undefined4)(uVar83 >> 0x20);
                local_460 = *(float *)(ray + k * 4 + 0x80);
                fVar147 = local_2c0[lVar86];
                local_3e0._4_4_ = fVar147;
                local_3e0._0_4_ = fVar147;
                local_3e0._8_4_ = fVar147;
                local_3e0._12_4_ = fVar147;
                local_580._0_8_ = lVar86;
                local_3d0 = *(undefined4 *)((long)&local_2a0 + lVar86 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + lVar86 * 4);
                local_690.context = context->user;
                fVar175 = 1.0 - fVar147;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar175),auVar22);
                auVar94 = ZEXT416((uint)(fVar147 * fVar175 * 4.0));
                auVar96 = vfnmsub213ss_fma(local_3e0,local_3e0,auVar94);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),auVar94);
                fVar175 = fVar175 * auVar93._0_4_ * 0.5;
                fVar176 = auVar96._0_4_ * 0.5;
                fVar177 = auVar94._0_4_ * 0.5;
                fVar147 = fVar147 * fVar147 * 0.5;
                auVar167._0_4_ = fVar147 * local_590;
                auVar167._4_4_ = fVar147 * fStack_58c;
                auVar167._8_4_ = fVar147 * fStack_588;
                auVar167._12_4_ = fVar147 * fStack_584;
                auVar150._4_4_ = fVar177;
                auVar150._0_4_ = fVar177;
                auVar150._8_4_ = fVar177;
                auVar150._12_4_ = fVar177;
                auVar76._4_4_ = uStack_62c;
                auVar76._0_4_ = local_630;
                auVar76._8_8_ = uStack_628;
                auVar94 = vfmadd132ps_fma(auVar150,auVar167,auVar76);
                auVar168._4_4_ = fVar176;
                auVar168._0_4_ = fVar176;
                auVar168._8_4_ = fVar176;
                auVar168._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar168,auVar94,local_610);
                auVar151._4_4_ = fVar175;
                auVar151._0_4_ = fVar175;
                auVar151._8_4_ = fVar175;
                auVar151._12_4_ = fVar175;
                auVar94 = vfmadd213ps_fma(auVar151,auVar20,auVar94);
                uVar148 = auVar94._0_4_;
                local_410._4_4_ = uVar148;
                local_410._0_4_ = uVar148;
                local_410._8_4_ = uVar148;
                local_410._12_4_ = uVar148;
                local_400 = vshufps_avx(auVar94,auVar94,0x55);
                local_3f0 = vshufps_avx(auVar94,auVar94,0xaa);
                local_3c0 = local_620._0_8_;
                uStack_3b8 = local_620._8_8_;
                local_3b0 = local_600;
                vpcmpeqd_avx2(ZEXT1632(local_600),ZEXT1632(local_600));
                uStack_39c = (local_690.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_690.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_6b0 = local_4a0._0_8_;
                uStack_6a8 = local_4a0._8_8_;
                local_690.valid = (int *)&local_6b0;
                local_690.geometryUserPtr = *(void **)(local_540._0_8_ + 0x18);
                local_690.hit = local_410;
                local_690.N = 4;
                local_690.ray = (RTCRayN *)ray;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                if (*(code **)(local_540._0_8_ + 0x48) != (code *)0x0) {
                  (**(code **)(local_540._0_8_ + 0x48))(&local_690);
                  auVar192 = ZEXT1664(local_640);
                  auVar183 = ZEXT3264(local_5c0);
                  auVar196 = ZEXT3264(local_5e0);
                  auVar197 = ZEXT3264(local_4e0);
                  auVar199 = ZEXT3264(local_4c0);
                  in_ZMM20 = ZEXT3264(local_500);
                  auVar94 = vxorps_avx512vl(auVar92,auVar92);
                  auVar200 = ZEXT1664(auVar94);
                  auVar198 = ZEXT3264(local_520);
                  fVar166 = local_560;
                }
                auVar94 = auVar200._0_16_;
                auVar72._8_8_ = uStack_6a8;
                auVar72._0_8_ = local_6b0;
                uVar90 = vptestmd_avx512vl(auVar72,auVar72);
                if ((uVar90 & 0xf) == 0) {
                  uVar83 = CONCAT44(uStack_43c,local_440);
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_540._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_690);
                    auVar192 = ZEXT1664(local_640);
                    auVar183 = ZEXT3264(local_5c0);
                    auVar196 = ZEXT3264(local_5e0);
                    auVar197 = ZEXT3264(local_4e0);
                    auVar199 = ZEXT3264(local_4c0);
                    in_ZMM20 = ZEXT3264(local_500);
                    auVar94 = vxorps_avx512vl(auVar94,auVar94);
                    auVar200 = ZEXT1664(auVar94);
                    auVar198 = ZEXT3264(local_520);
                    fVar166 = local_560;
                  }
                  auVar103 = auVar183._0_32_;
                  auVar73._8_8_ = uStack_6a8;
                  auVar73._0_8_ = local_6b0;
                  auVar94 = *(undefined1 (*) [16])(local_690.ray + 0x80);
                  uVar90 = vptestmd_avx512vl(auVar73,auVar73);
                  uVar90 = uVar90 & 0xf;
                  auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar90 & 1);
                  auVar99._0_4_ = (uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar94._0_4_;
                  bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
                  auVar99._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar94._4_4_;
                  bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                  auVar99._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar94._8_4_;
                  bVar13 = SUB81(uVar90 >> 3,0);
                  auVar99._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar94._12_4_;
                  *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar99;
                  uVar83 = CONCAT44(uStack_43c,local_440);
                  fVar147 = auVar192._0_4_;
                  if ((byte)uVar90 != 0) break;
                }
                auVar103 = auVar183._0_32_;
                *(float *)(ray + k * 4 + 0x80) = local_460;
                lVar86 = 0;
                uVar83 = uVar83 ^ 1L << (local_580._0_8_ & 0x3f);
                for (uVar90 = uVar83; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000)
                {
                  lVar86 = lVar86 + 1;
                }
                bVar81 = uVar83 != 0;
                fVar147 = auVar192._0_4_;
              } while (bVar81);
              local_560 = fVar147;
              auVar179 = ZEXT3264(auVar106);
              auVar158 = ZEXT3264(auVar105);
            }
          }
        }
      }
      local_520 = auVar198._0_32_;
      if (8 < iVar10) {
        local_540 = vpbroadcastd_avx512vl();
        local_460 = 1.0 / (float)local_5f0._0_4_;
        auVar80._28_4_ = 0;
        auVar80._0_28_ = stack0xfffffffffffff9a4;
        _local_660 = auVar80 << 0x20;
        local_5f0 = vpbroadcastd_avx512vl();
        local_580 = vpbroadcastd_avx512vl();
        lVar86 = 8;
        auVar105 = auVar179._0_32_;
        auVar107 = auVar158._0_32_;
        local_5c0 = auVar103;
        fStack_55c = local_560;
        fStack_558 = local_560;
        fStack_554 = local_560;
        fStack_550 = local_560;
        fStack_54c = local_560;
        fStack_548 = local_560;
        fStack_544 = local_560;
        fStack_45c = local_460;
        fStack_458 = local_460;
        fStack_454 = local_460;
        fStack_450 = local_460;
        fStack_44c = local_460;
        fStack_448 = local_460;
        fStack_444 = local_460;
        local_440 = fVar166;
        uStack_43c = fVar166;
        uStack_438 = fVar166;
        uStack_434 = fVar166;
        uStack_430 = fVar166;
        uStack_42c = fVar166;
        uStack_428 = fVar166;
        uStack_424 = fVar166;
        do {
          auVar106 = vpbroadcastd_avx512vl();
          auVar108 = vpor_avx2(auVar106,_DAT_0205a920);
          uVar21 = vpcmpd_avx512vl(auVar108,local_540,1);
          auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar86 * 4 + lVar70);
          auVar118 = *(undefined1 (*) [32])(lVar70 + 0x222bfac + lVar86 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar70 + 0x222c430 + lVar86 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar70 + 0x222c8b4 + lVar86 * 4);
          auVar109 = vmulps_avx512vl(local_e0,auVar116);
          auVar115 = vmulps_avx512vl(local_100,auVar116);
          auVar51._4_4_ = auVar116._4_4_ * (float)local_180._4_4_;
          auVar51._0_4_ = auVar116._0_4_ * (float)local_180._0_4_;
          auVar51._8_4_ = auVar116._8_4_ * fStack_178;
          auVar51._12_4_ = auVar116._12_4_ * fStack_174;
          auVar51._16_4_ = auVar116._16_4_ * fStack_170;
          auVar51._20_4_ = auVar116._20_4_ * fStack_16c;
          auVar51._24_4_ = auVar116._24_4_ * fStack_168;
          auVar51._28_4_ = auVar108._28_4_;
          auVar108 = vfmadd231ps_avx512vl(auVar109,auVar117,local_a0);
          auVar109 = vfmadd231ps_avx512vl(auVar115,auVar117,local_c0);
          auVar115 = vfmadd231ps_avx512vl(auVar51,auVar117,local_160);
          auVar180 = auVar196._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar118,auVar180);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar118,local_200);
          auVar94 = vfmadd231ps_fma(auVar115,auVar118,local_140);
          auVar190 = auVar199._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar190);
          auVar181 = auVar197._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar181);
          auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar86 * 4 + lVar70);
          auVar109 = *(undefined1 (*) [32])(lVar70 + 0x222e3cc + lVar86 * 4);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,local_120);
          auVar115 = *(undefined1 (*) [32])(lVar70 + 0x222e850 + lVar86 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar70 + 0x222ecd4 + lVar86 * 4);
          auVar103 = vmulps_avx512vl(local_e0,auVar114);
          auVar104 = vmulps_avx512vl(local_100,auVar114);
          auVar52._4_4_ = auVar114._4_4_ * (float)local_180._4_4_;
          auVar52._0_4_ = auVar114._0_4_ * (float)local_180._0_4_;
          auVar52._8_4_ = auVar114._8_4_ * fStack_178;
          auVar52._12_4_ = auVar114._12_4_ * fStack_174;
          auVar52._16_4_ = auVar114._16_4_ * fStack_170;
          auVar52._20_4_ = auVar114._20_4_ * fStack_16c;
          auVar52._24_4_ = auVar114._24_4_ * fStack_168;
          auVar52._28_4_ = uStack_164;
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_a0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_c0);
          auVar102 = vfmadd231ps_avx512vl(auVar52,auVar115,local_160);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,auVar180);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_200);
          auVar96 = vfmadd231ps_fma(auVar102,auVar109,local_140);
          auVar102 = vfmadd231ps_avx512vl(auVar103,auVar108,auVar190);
          auVar111 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar181);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar108,local_120);
          auVar112 = vmaxps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar96));
          auVar103 = vsubps_avx(auVar102,auVar110);
          auVar104 = vsubps_avx(auVar111,auVar101);
          auVar113 = vmulps_avx512vl(auVar101,auVar103);
          auVar129 = vmulps_avx512vl(auVar110,auVar104);
          auVar113 = vsubps_avx512vl(auVar113,auVar129);
          auVar129 = vmulps_avx512vl(auVar104,auVar104);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar103,auVar103);
          auVar112 = vmulps_avx512vl(auVar112,auVar112);
          auVar112 = vmulps_avx512vl(auVar112,auVar129);
          auVar113 = vmulps_avx512vl(auVar113,auVar113);
          uVar149 = vcmpps_avx512vl(auVar113,auVar112,2);
          local_2d0 = (byte)uVar21 & (byte)uVar149;
          if (local_2d0 == 0) {
            auVar196 = ZEXT3264(auVar180);
LAB_01d554ab:
            auVar192 = ZEXT3264(auVar181);
          }
          else {
            auVar114 = vmulps_avx512vl(local_5c0,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_1e0,auVar114);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_1c0,auVar115);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_1a0,auVar109);
            auVar116 = vmulps_avx512vl(local_5c0,auVar116);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_1e0,auVar116);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_1c0,auVar117);
            auVar109 = vfmadd213ps_avx512vl(auVar106,local_1a0,auVar118);
            auVar106 = *(undefined1 (*) [32])(lVar70 + 0x222cd38 + lVar86 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar70 + 0x222d1bc + lVar86 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar70 + 0x222d640 + lVar86 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar70 + 0x222dac4 + lVar86 * 4);
            auVar115 = vmulps_avx512vl(local_e0,auVar116);
            auVar114 = vmulps_avx512vl(local_100,auVar116);
            auVar116 = vmulps_avx512vl(local_5c0,auVar116);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,local_a0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_c0);
            auVar117 = vfmadd231ps_avx512vl(auVar116,local_1e0,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar115,auVar118,auVar180);
            auVar115 = vfmadd231ps_avx512vl(auVar114,auVar118,local_200);
            auVar118 = vfmadd231ps_avx512vl(auVar117,local_1c0,auVar118);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar106,auVar190);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,auVar181);
            auVar114 = vfmadd231ps_avx512vl(auVar118,local_1a0,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar70 + 0x222f158 + lVar86 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar70 + 0x222fa60 + lVar86 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar70 + 0x222fee4 + lVar86 * 4);
            auVar112 = vmulps_avx512vl(local_e0,auVar117);
            auVar113 = vmulps_avx512vl(local_100,auVar117);
            auVar117 = vmulps_avx512vl(local_5c0,auVar117);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_a0);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_c0);
            auVar117 = vfmadd231ps_avx512vl(auVar117,local_1e0,auVar118);
            auVar118 = *(undefined1 (*) [32])(lVar70 + 0x222f5dc + lVar86 * 4);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,auVar180);
            auVar93 = vfmadd231ps_fma(auVar113,auVar118,local_200);
            auVar118 = vfmadd231ps_avx512vl(auVar117,local_1c0,auVar118);
            auVar117 = vfmadd231ps_avx512vl(auVar112,auVar106,auVar190);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar106,auVar181);
            auVar118 = vfmadd231ps_avx512vl(auVar118,local_1a0,auVar106);
            auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar116,auVar113);
            vandps_avx512vl(auVar115,auVar113);
            auVar106 = vmaxps_avx(auVar113,auVar113);
            vandps_avx512vl(auVar114,auVar113);
            auVar106 = vmaxps_avx(auVar106,auVar113);
            auVar78._4_4_ = fStack_55c;
            auVar78._0_4_ = local_560;
            auVar78._8_4_ = fStack_558;
            auVar78._12_4_ = fStack_554;
            auVar78._16_4_ = fStack_550;
            auVar78._20_4_ = fStack_54c;
            auVar78._24_4_ = fStack_548;
            auVar78._28_4_ = fStack_544;
            uVar90 = vcmpps_avx512vl(auVar106,auVar78,1);
            bVar13 = (bool)((byte)uVar90 & 1);
            auVar130._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar116._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar116._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar116._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar116._12_4_);
            bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar116._16_4_);
            bVar13 = (bool)((byte)(uVar90 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar116._20_4_);
            bVar13 = (bool)((byte)(uVar90 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar116._24_4_);
            bVar13 = SUB81(uVar90 >> 7,0);
            auVar130._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar116._28_4_;
            bVar13 = (bool)((byte)uVar90 & 1);
            auVar131._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar115._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar115._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar115._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar115._12_4_);
            bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
            auVar131._16_4_ =
                 (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar115._16_4_);
            bVar13 = (bool)((byte)(uVar90 >> 5) & 1);
            auVar131._20_4_ =
                 (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar115._20_4_);
            bVar13 = (bool)((byte)(uVar90 >> 6) & 1);
            auVar131._24_4_ =
                 (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar115._24_4_);
            bVar13 = SUB81(uVar90 >> 7,0);
            auVar131._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar115._28_4_;
            vandps_avx512vl(auVar117,auVar113);
            vandps_avx512vl(auVar112,auVar113);
            auVar106 = vmaxps_avx(auVar131,auVar131);
            vandps_avx512vl(auVar118,auVar113);
            auVar106 = vmaxps_avx(auVar106,auVar131);
            uVar90 = vcmpps_avx512vl(auVar106,auVar78,1);
            bVar13 = (bool)((byte)uVar90 & 1);
            auVar132._0_4_ = (uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar117._0_4_;
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar117._4_4_;
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar117._8_4_;
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar117._12_4_;
            bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
            auVar132._16_4_ = (uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar117._16_4_;
            bVar13 = (bool)((byte)(uVar90 >> 5) & 1);
            auVar132._20_4_ = (uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar117._20_4_;
            bVar13 = (bool)((byte)(uVar90 >> 6) & 1);
            auVar132._24_4_ = (uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar117._24_4_;
            bVar13 = SUB81(uVar90 >> 7,0);
            auVar132._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar117._28_4_;
            bVar13 = (bool)((byte)uVar90 & 1);
            auVar133._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar112._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar112._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar112._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar112._12_4_);
            bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
            auVar133._16_4_ =
                 (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar112._16_4_);
            bVar13 = (bool)((byte)(uVar90 >> 5) & 1);
            auVar133._20_4_ =
                 (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar112._20_4_);
            bVar13 = (bool)((byte)(uVar90 >> 6) & 1);
            auVar133._24_4_ =
                 (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar112._24_4_);
            bVar13 = SUB81(uVar90 >> 7,0);
            auVar133._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar112._28_4_;
            auVar185._8_4_ = 0x80000000;
            auVar185._0_8_ = 0x8000000080000000;
            auVar185._12_4_ = 0x80000000;
            auVar185._16_4_ = 0x80000000;
            auVar185._20_4_ = 0x80000000;
            auVar185._24_4_ = 0x80000000;
            auVar185._28_4_ = 0x80000000;
            auVar106 = vxorps_avx512vl(auVar132,auVar185);
            auVar112 = auVar200._0_32_;
            auVar118 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar112);
            auVar93 = vfmadd231ps_fma(auVar118,auVar131,auVar131);
            auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
            auVar195._8_4_ = 0xbf000000;
            auVar195._0_8_ = 0xbf000000bf000000;
            auVar195._12_4_ = 0xbf000000;
            auVar195._16_4_ = 0xbf000000;
            auVar195._20_4_ = 0xbf000000;
            auVar195._24_4_ = 0xbf000000;
            auVar195._28_4_ = 0xbf000000;
            fVar166 = auVar118._0_4_;
            fVar147 = auVar118._4_4_;
            fVar175 = auVar118._8_4_;
            fVar176 = auVar118._12_4_;
            fVar177 = auVar118._16_4_;
            fVar160 = auVar118._20_4_;
            fVar165 = auVar118._24_4_;
            auVar53._4_4_ = fVar147 * fVar147 * fVar147 * auVar93._4_4_ * -0.5;
            auVar53._0_4_ = fVar166 * fVar166 * fVar166 * auVar93._0_4_ * -0.5;
            auVar53._8_4_ = fVar175 * fVar175 * fVar175 * auVar93._8_4_ * -0.5;
            auVar53._12_4_ = fVar176 * fVar176 * fVar176 * auVar93._12_4_ * -0.5;
            auVar53._16_4_ = fVar177 * fVar177 * fVar177 * -0.0;
            auVar53._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar53._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar53._28_4_ = auVar131._28_4_;
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar118 = vfmadd231ps_avx512vl(auVar53,auVar117,auVar118);
            auVar54._4_4_ = auVar131._4_4_ * auVar118._4_4_;
            auVar54._0_4_ = auVar131._0_4_ * auVar118._0_4_;
            auVar54._8_4_ = auVar131._8_4_ * auVar118._8_4_;
            auVar54._12_4_ = auVar131._12_4_ * auVar118._12_4_;
            auVar54._16_4_ = auVar131._16_4_ * auVar118._16_4_;
            auVar54._20_4_ = auVar131._20_4_ * auVar118._20_4_;
            auVar54._24_4_ = auVar131._24_4_ * auVar118._24_4_;
            auVar54._28_4_ = 0;
            auVar55._4_4_ = auVar118._4_4_ * -auVar130._4_4_;
            auVar55._0_4_ = auVar118._0_4_ * -auVar130._0_4_;
            auVar55._8_4_ = auVar118._8_4_ * -auVar130._8_4_;
            auVar55._12_4_ = auVar118._12_4_ * -auVar130._12_4_;
            auVar55._16_4_ = auVar118._16_4_ * -auVar130._16_4_;
            auVar55._20_4_ = auVar118._20_4_ * -auVar130._20_4_;
            auVar55._24_4_ = auVar118._24_4_ * -auVar130._24_4_;
            auVar55._28_4_ = auVar131._28_4_;
            auVar116 = vmulps_avx512vl(auVar118,auVar112);
            auVar118 = vfmadd213ps_avx512vl(auVar132,auVar132,auVar112);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar133,auVar133);
            auVar115 = vrsqrt14ps_avx512vl(auVar118);
            auVar118 = vmulps_avx512vl(auVar118,auVar195);
            fVar166 = auVar115._0_4_;
            fVar147 = auVar115._4_4_;
            fVar175 = auVar115._8_4_;
            fVar176 = auVar115._12_4_;
            fVar177 = auVar115._16_4_;
            fVar160 = auVar115._20_4_;
            fVar165 = auVar115._24_4_;
            auVar56._4_4_ = fVar147 * fVar147 * fVar147 * auVar118._4_4_;
            auVar56._0_4_ = fVar166 * fVar166 * fVar166 * auVar118._0_4_;
            auVar56._8_4_ = fVar175 * fVar175 * fVar175 * auVar118._8_4_;
            auVar56._12_4_ = fVar176 * fVar176 * fVar176 * auVar118._12_4_;
            auVar56._16_4_ = fVar177 * fVar177 * fVar177 * auVar118._16_4_;
            auVar56._20_4_ = fVar160 * fVar160 * fVar160 * auVar118._20_4_;
            auVar56._24_4_ = fVar165 * fVar165 * fVar165 * auVar118._24_4_;
            auVar56._28_4_ = auVar118._28_4_;
            auVar118 = vfmadd231ps_avx512vl(auVar56,auVar117,auVar115);
            auVar57._4_4_ = auVar133._4_4_ * auVar118._4_4_;
            auVar57._0_4_ = auVar133._0_4_ * auVar118._0_4_;
            auVar57._8_4_ = auVar133._8_4_ * auVar118._8_4_;
            auVar57._12_4_ = auVar133._12_4_ * auVar118._12_4_;
            auVar57._16_4_ = auVar133._16_4_ * auVar118._16_4_;
            auVar57._20_4_ = auVar133._20_4_ * auVar118._20_4_;
            auVar57._24_4_ = auVar133._24_4_ * auVar118._24_4_;
            auVar57._28_4_ = auVar115._28_4_;
            auVar58._4_4_ = auVar118._4_4_ * auVar106._4_4_;
            auVar58._0_4_ = auVar118._0_4_ * auVar106._0_4_;
            auVar58._8_4_ = auVar118._8_4_ * auVar106._8_4_;
            auVar58._12_4_ = auVar118._12_4_ * auVar106._12_4_;
            auVar58._16_4_ = auVar118._16_4_ * auVar106._16_4_;
            auVar58._20_4_ = auVar118._20_4_ * auVar106._20_4_;
            auVar58._24_4_ = auVar118._24_4_ * auVar106._24_4_;
            auVar58._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(auVar118,auVar112);
            auVar93 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar94),auVar110);
            auVar118 = ZEXT1632(auVar94);
            auVar92 = vfmadd213ps_fma(auVar55,auVar118,auVar101);
            auVar117 = vfmadd213ps_avx512vl(auVar116,auVar118,auVar109);
            auVar115 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar96),auVar102);
            auVar95 = vfnmadd213ps_fma(auVar54,auVar118,auVar110);
            auVar114 = ZEXT1632(auVar96);
            auVar5 = vfmadd213ps_fma(auVar58,auVar114,auVar111);
            auVar97 = vfnmadd213ps_fma(auVar55,auVar118,auVar101);
            auVar6 = vfmadd213ps_fma(auVar106,auVar114,auVar108);
            auVar101 = ZEXT1632(auVar94);
            auVar98 = vfnmadd231ps_fma(auVar109,auVar101,auVar116);
            auVar161 = vfnmadd213ps_fma(auVar57,auVar114,auVar102);
            auVar162 = vfnmadd213ps_fma(auVar58,auVar114,auVar111);
            auVar184 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar96),auVar106);
            auVar108 = vsubps_avx512vl(auVar115,ZEXT1632(auVar95));
            auVar106 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar97));
            auVar118 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar98));
            auVar59._4_4_ = auVar106._4_4_ * auVar98._4_4_;
            auVar59._0_4_ = auVar106._0_4_ * auVar98._0_4_;
            auVar59._8_4_ = auVar106._8_4_ * auVar98._8_4_;
            auVar59._12_4_ = auVar106._12_4_ * auVar98._12_4_;
            auVar59._16_4_ = auVar106._16_4_ * 0.0;
            auVar59._20_4_ = auVar106._20_4_ * 0.0;
            auVar59._24_4_ = auVar106._24_4_ * 0.0;
            auVar59._28_4_ = auVar116._28_4_;
            auVar94 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar97),auVar118);
            auVar60._4_4_ = auVar118._4_4_ * auVar95._4_4_;
            auVar60._0_4_ = auVar118._0_4_ * auVar95._0_4_;
            auVar60._8_4_ = auVar118._8_4_ * auVar95._8_4_;
            auVar60._12_4_ = auVar118._12_4_ * auVar95._12_4_;
            auVar60._16_4_ = auVar118._16_4_ * 0.0;
            auVar60._20_4_ = auVar118._20_4_ * 0.0;
            auVar60._24_4_ = auVar118._24_4_ * 0.0;
            auVar60._28_4_ = auVar118._28_4_;
            auVar7 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar98),auVar108);
            auVar61._4_4_ = auVar97._4_4_ * auVar108._4_4_;
            auVar61._0_4_ = auVar97._0_4_ * auVar108._0_4_;
            auVar61._8_4_ = auVar97._8_4_ * auVar108._8_4_;
            auVar61._12_4_ = auVar97._12_4_ * auVar108._12_4_;
            auVar61._16_4_ = auVar108._16_4_ * 0.0;
            auVar61._20_4_ = auVar108._20_4_ * 0.0;
            auVar61._24_4_ = auVar108._24_4_ * 0.0;
            auVar61._28_4_ = auVar108._28_4_;
            auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar95),auVar106);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar112,ZEXT1632(auVar7));
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar112,ZEXT1632(auVar94));
            uVar90 = vcmpps_avx512vl(auVar106,auVar112,2);
            bVar84 = (byte)uVar90;
            fVar139 = (float)((uint)(bVar84 & 1) * auVar93._0_4_ |
                             (uint)!(bool)(bVar84 & 1) * auVar161._0_4_);
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            fVar141 = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar161._4_4_);
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            fVar143 = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar161._8_4_);
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            fVar145 = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar161._12_4_);
            auVar114 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar141,fVar139))));
            fVar140 = (float)((uint)(bVar84 & 1) * auVar92._0_4_ |
                             (uint)!(bool)(bVar84 & 1) * auVar162._0_4_);
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            fVar142 = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar162._4_4_);
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            fVar144 = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar162._8_4_);
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            fVar146 = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar162._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar140))));
            auVar134._0_4_ =
                 (float)((uint)(bVar84 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar184._0_4_);
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar184._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar184._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar184._12_4_);
            fVar175 = (float)((uint)((byte)(uVar90 >> 4) & 1) * auVar117._16_4_);
            auVar134._16_4_ = fVar175;
            fVar147 = (float)((uint)((byte)(uVar90 >> 5) & 1) * auVar117._20_4_);
            auVar134._20_4_ = fVar147;
            fVar166 = (float)((uint)((byte)(uVar90 >> 6) & 1) * auVar117._24_4_);
            auVar134._24_4_ = fVar166;
            iVar1 = (uint)(byte)(uVar90 >> 7) * auVar117._28_4_;
            auVar134._28_4_ = iVar1;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar95),auVar115);
            auVar135._0_4_ =
                 (uint)(bVar84 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar94._0_4_;
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar94._4_4_;
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar94._8_4_;
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar94._12_4_;
            auVar135._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar106._16_4_;
            auVar135._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar106._20_4_;
            auVar135._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar106._24_4_;
            auVar135._28_4_ = (uint)(byte)(uVar90 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar5));
            auVar136._0_4_ =
                 (float)((uint)(bVar84 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar93._0_4_);
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar93._4_4_);
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar93._8_4_);
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar93._12_4_);
            fVar176 = (float)((uint)((byte)(uVar90 >> 4) & 1) * auVar106._16_4_);
            auVar136._16_4_ = fVar176;
            fVar177 = (float)((uint)((byte)(uVar90 >> 5) & 1) * auVar106._20_4_);
            auVar136._20_4_ = fVar177;
            fVar160 = (float)((uint)((byte)(uVar90 >> 6) & 1) * auVar106._24_4_);
            auVar136._24_4_ = fVar160;
            auVar136._28_4_ = (uint)(byte)(uVar90 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar6));
            auVar137._0_4_ =
                 (float)((uint)(bVar84 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar92._0_4_);
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar92._4_4_);
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar92._8_4_);
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar92._12_4_);
            fVar159 = (float)((uint)((byte)(uVar90 >> 4) & 1) * auVar106._16_4_);
            auVar137._16_4_ = fVar159;
            fVar165 = (float)((uint)((byte)(uVar90 >> 5) & 1) * auVar106._20_4_);
            auVar137._20_4_ = fVar165;
            fVar91 = (float)((uint)((byte)(uVar90 >> 6) & 1) * auVar106._24_4_);
            auVar137._24_4_ = fVar91;
            iVar2 = (uint)(byte)(uVar90 >> 7) * auVar106._28_4_;
            auVar137._28_4_ = iVar2;
            auVar138._0_4_ =
                 (uint)(bVar84 & 1) * (int)auVar95._0_4_ |
                 (uint)!(bool)(bVar84 & 1) * auVar115._0_4_;
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            auVar138._4_4_ = (uint)bVar13 * (int)auVar95._4_4_ | (uint)!bVar13 * auVar115._4_4_;
            bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
            auVar138._8_4_ = (uint)bVar13 * (int)auVar95._8_4_ | (uint)!bVar13 * auVar115._8_4_;
            bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar138._12_4_ = (uint)bVar13 * (int)auVar95._12_4_ | (uint)!bVar13 * auVar115._12_4_;
            auVar138._16_4_ = (uint)!(bool)((byte)(uVar90 >> 4) & 1) * auVar115._16_4_;
            auVar138._20_4_ = (uint)!(bool)((byte)(uVar90 >> 5) & 1) * auVar115._20_4_;
            auVar138._24_4_ = (uint)!(bool)((byte)(uVar90 >> 6) & 1) * auVar115._24_4_;
            auVar138._28_4_ = (uint)!SUB81(uVar90 >> 7,0) * auVar115._28_4_;
            bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar90 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar90 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar90 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar90 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar90 >> 3) & 1);
            auVar115 = vsubps_avx512vl(auVar138,auVar114);
            auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar97._12_4_ |
                                                     (uint)!bVar17 * auVar5._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar97._8_4_ |
                                                              (uint)!bVar15 * auVar5._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar13 * auVar5._4_4_,
                                                                       (uint)(bVar84 & 1) *
                                                                       (int)auVar97._0_4_ |
                                                                       (uint)!(bool)(bVar84 & 1) *
                                                                       auVar5._0_4_)))),auVar103);
            auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar98._12_4_ |
                                                     (uint)!bVar18 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar98._8_4_ |
                                                              (uint)!bVar16 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar98._4_4_ |
                                                                       (uint)!bVar14 * auVar6._4_4_,
                                                                       (uint)(bVar84 & 1) *
                                                                       (int)auVar98._0_4_ |
                                                                       (uint)!(bool)(bVar84 & 1) *
                                                                       auVar6._0_4_)))),auVar134);
            auVar116 = vsubps_avx(auVar114,auVar135);
            auVar108 = vsubps_avx(auVar103,auVar136);
            auVar109 = vsubps_avx(auVar134,auVar137);
            auVar62._4_4_ = auVar117._4_4_ * fVar141;
            auVar62._0_4_ = auVar117._0_4_ * fVar139;
            auVar62._8_4_ = auVar117._8_4_ * fVar143;
            auVar62._12_4_ = auVar117._12_4_ * fVar145;
            auVar62._16_4_ = auVar117._16_4_ * 0.0;
            auVar62._20_4_ = auVar117._20_4_ * 0.0;
            auVar62._24_4_ = auVar117._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar62,auVar134,auVar115);
            auVar164._0_4_ = fVar140 * auVar115._0_4_;
            auVar164._4_4_ = fVar142 * auVar115._4_4_;
            auVar164._8_4_ = fVar144 * auVar115._8_4_;
            auVar164._12_4_ = fVar146 * auVar115._12_4_;
            auVar164._16_4_ = auVar115._16_4_ * 0.0;
            auVar164._20_4_ = auVar115._20_4_ * 0.0;
            auVar164._24_4_ = auVar115._24_4_ * 0.0;
            auVar164._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar164,auVar114,auVar118);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar112,ZEXT1632(auVar94));
            auVar173._0_4_ = auVar118._0_4_ * auVar134._0_4_;
            auVar173._4_4_ = auVar118._4_4_ * auVar134._4_4_;
            auVar173._8_4_ = auVar118._8_4_ * auVar134._8_4_;
            auVar173._12_4_ = auVar118._12_4_ * auVar134._12_4_;
            auVar173._16_4_ = auVar118._16_4_ * fVar175;
            auVar173._20_4_ = auVar118._20_4_ * fVar147;
            auVar173._24_4_ = auVar118._24_4_ * fVar166;
            auVar173._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar173,auVar103,auVar117);
            auVar104 = vfmadd231ps_avx512vl(auVar106,auVar112,ZEXT1632(auVar94));
            auVar106 = vmulps_avx512vl(auVar109,auVar135);
            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar116,auVar137);
            auVar63._4_4_ = auVar108._4_4_ * auVar137._4_4_;
            auVar63._0_4_ = auVar108._0_4_ * auVar137._0_4_;
            auVar63._8_4_ = auVar108._8_4_ * auVar137._8_4_;
            auVar63._12_4_ = auVar108._12_4_ * auVar137._12_4_;
            auVar63._16_4_ = auVar108._16_4_ * fVar159;
            auVar63._20_4_ = auVar108._20_4_ * fVar165;
            auVar63._24_4_ = auVar108._24_4_ * fVar91;
            auVar63._28_4_ = iVar2;
            auVar94 = vfmsub231ps_fma(auVar63,auVar136,auVar109);
            auVar174._0_4_ = auVar136._0_4_ * auVar116._0_4_;
            auVar174._4_4_ = auVar136._4_4_ * auVar116._4_4_;
            auVar174._8_4_ = auVar136._8_4_ * auVar116._8_4_;
            auVar174._12_4_ = auVar136._12_4_ * auVar116._12_4_;
            auVar174._16_4_ = fVar176 * auVar116._16_4_;
            auVar174._20_4_ = fVar177 * auVar116._20_4_;
            auVar174._24_4_ = fVar160 * auVar116._24_4_;
            auVar174._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar174,auVar108,auVar135);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar112,auVar106);
            auVar110 = vfmadd231ps_avx512vl(auVar106,auVar112,ZEXT1632(auVar94));
            auVar106 = vmaxps_avx(auVar104,auVar110);
            uVar149 = vcmpps_avx512vl(auVar106,auVar112,2);
            local_2d0 = local_2d0 & (byte)uVar149;
            auVar192 = ZEXT3264(auVar181);
            if (local_2d0 == 0) {
LAB_01d554e6:
              local_2d0 = 0;
            }
            else {
              auVar64._4_4_ = auVar109._4_4_ * auVar118._4_4_;
              auVar64._0_4_ = auVar109._0_4_ * auVar118._0_4_;
              auVar64._8_4_ = auVar109._8_4_ * auVar118._8_4_;
              auVar64._12_4_ = auVar109._12_4_ * auVar118._12_4_;
              auVar64._16_4_ = auVar109._16_4_ * auVar118._16_4_;
              auVar64._20_4_ = auVar109._20_4_ * auVar118._20_4_;
              auVar64._24_4_ = auVar109._24_4_ * auVar118._24_4_;
              auVar64._28_4_ = auVar106._28_4_;
              auVar92 = vfmsub231ps_fma(auVar64,auVar108,auVar117);
              auVar65._4_4_ = auVar117._4_4_ * auVar116._4_4_;
              auVar65._0_4_ = auVar117._0_4_ * auVar116._0_4_;
              auVar65._8_4_ = auVar117._8_4_ * auVar116._8_4_;
              auVar65._12_4_ = auVar117._12_4_ * auVar116._12_4_;
              auVar65._16_4_ = auVar117._16_4_ * auVar116._16_4_;
              auVar65._20_4_ = auVar117._20_4_ * auVar116._20_4_;
              auVar65._24_4_ = auVar117._24_4_ * auVar116._24_4_;
              auVar65._28_4_ = auVar117._28_4_;
              auVar93 = vfmsub231ps_fma(auVar65,auVar115,auVar109);
              auVar66._4_4_ = auVar108._4_4_ * auVar115._4_4_;
              auVar66._0_4_ = auVar108._0_4_ * auVar115._0_4_;
              auVar66._8_4_ = auVar108._8_4_ * auVar115._8_4_;
              auVar66._12_4_ = auVar108._12_4_ * auVar115._12_4_;
              auVar66._16_4_ = auVar108._16_4_ * auVar115._16_4_;
              auVar66._20_4_ = auVar108._20_4_ * auVar115._20_4_;
              auVar66._24_4_ = auVar108._24_4_ * auVar115._24_4_;
              auVar66._28_4_ = auVar108._28_4_;
              auVar5 = vfmsub231ps_fma(auVar66,auVar116,auVar118);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar5));
              auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar92),auVar112);
              auVar118 = vrcp14ps_avx512vl(auVar106);
              auVar28._8_4_ = 0x3f800000;
              auVar28._0_8_ = &DAT_3f8000003f800000;
              auVar28._12_4_ = 0x3f800000;
              auVar28._16_4_ = 0x3f800000;
              auVar28._20_4_ = 0x3f800000;
              auVar28._24_4_ = 0x3f800000;
              auVar28._28_4_ = 0x3f800000;
              auVar117 = vfnmadd213ps_avx512vl(auVar118,auVar106,auVar28);
              auVar94 = vfmadd132ps_fma(auVar117,auVar118,auVar118);
              auVar67._4_4_ = auVar5._4_4_ * auVar134._4_4_;
              auVar67._0_4_ = auVar5._0_4_ * auVar134._0_4_;
              auVar67._8_4_ = auVar5._8_4_ * auVar134._8_4_;
              auVar67._12_4_ = auVar5._12_4_ * auVar134._12_4_;
              auVar67._16_4_ = fVar175 * 0.0;
              auVar67._20_4_ = fVar147 * 0.0;
              auVar67._24_4_ = fVar166 * 0.0;
              auVar67._28_4_ = iVar1;
              auVar93 = vfmadd231ps_fma(auVar67,auVar103,ZEXT1632(auVar93));
              auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar114,ZEXT1632(auVar92));
              fVar166 = auVar94._0_4_;
              fVar147 = auVar94._4_4_;
              fVar175 = auVar94._8_4_;
              fVar176 = auVar94._12_4_;
              auVar118 = ZEXT1632(CONCAT412(auVar93._12_4_ * fVar176,
                                            CONCAT48(auVar93._8_4_ * fVar175,
                                                     CONCAT44(auVar93._4_4_ * fVar147,
                                                              auVar93._0_4_ * fVar166))));
              auVar79._4_4_ = uStack_43c;
              auVar79._0_4_ = local_440;
              auVar79._8_4_ = uStack_438;
              auVar79._12_4_ = uStack_434;
              auVar79._16_4_ = uStack_430;
              auVar79._20_4_ = uStack_42c;
              auVar79._24_4_ = uStack_428;
              auVar79._28_4_ = uStack_424;
              uVar149 = vcmpps_avx512vl(auVar118,auVar79,0xd);
              uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar29._4_4_ = uVar148;
              auVar29._0_4_ = uVar148;
              auVar29._8_4_ = uVar148;
              auVar29._12_4_ = uVar148;
              auVar29._16_4_ = uVar148;
              auVar29._20_4_ = uVar148;
              auVar29._24_4_ = uVar148;
              auVar29._28_4_ = uVar148;
              uVar21 = vcmpps_avx512vl(auVar118,auVar29,2);
              local_2d0 = (byte)uVar149 & (byte)uVar21 & local_2d0;
              if (local_2d0 == 0) goto LAB_01d554e6;
              uVar149 = vcmpps_avx512vl(auVar106,auVar112,4);
              if ((local_2d0 & (byte)uVar149) == 0) {
                local_2d0 = 0;
              }
              else {
                local_2d0 = local_2d0 & (byte)uVar149;
                fVar177 = auVar104._0_4_ * fVar166;
                fVar160 = auVar104._4_4_ * fVar147;
                auVar68._4_4_ = fVar160;
                auVar68._0_4_ = fVar177;
                fVar165 = auVar104._8_4_ * fVar175;
                auVar68._8_4_ = fVar165;
                fVar91 = auVar104._12_4_ * fVar176;
                auVar68._12_4_ = fVar91;
                fVar159 = auVar104._16_4_ * 0.0;
                auVar68._16_4_ = fVar159;
                fVar139 = auVar104._20_4_ * 0.0;
                auVar68._20_4_ = fVar139;
                fVar140 = auVar104._24_4_ * 0.0;
                auVar68._24_4_ = fVar140;
                auVar68._28_4_ = auVar104._28_4_;
                fVar166 = auVar110._0_4_ * fVar166;
                fVar147 = auVar110._4_4_ * fVar147;
                auVar69._4_4_ = fVar147;
                auVar69._0_4_ = fVar166;
                fVar175 = auVar110._8_4_ * fVar175;
                auVar69._8_4_ = fVar175;
                fVar176 = auVar110._12_4_ * fVar176;
                auVar69._12_4_ = fVar176;
                fVar141 = auVar110._16_4_ * 0.0;
                auVar69._16_4_ = fVar141;
                fVar142 = auVar110._20_4_ * 0.0;
                auVar69._20_4_ = fVar142;
                fVar143 = auVar110._24_4_ * 0.0;
                auVar69._24_4_ = fVar143;
                auVar69._28_4_ = auVar110._28_4_;
                auVar178._8_4_ = 0x3f800000;
                auVar178._0_8_ = &DAT_3f8000003f800000;
                auVar178._12_4_ = 0x3f800000;
                auVar178._16_4_ = 0x3f800000;
                auVar178._20_4_ = 0x3f800000;
                auVar178._24_4_ = 0x3f800000;
                auVar178._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx512vl(auVar178,auVar68);
                bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar90 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar90 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar90 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar90 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar90 >> 6) & 1);
                bVar19 = SUB81(uVar90 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar104._28_4_ |
                                              (uint)!bVar19 * auVar106._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar140 |
                                                        (uint)!bVar18 * auVar106._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar139 |
                                                                  (uint)!bVar17 * auVar106._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar159 |
                                                                            (uint)!bVar16 *
                                                                            auVar106._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar91 |
                                                                                      (uint)!bVar15
                                                                                      * auVar106.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar165 |
                                                                  (uint)!bVar14 * auVar106._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar160 |
                                                                           (uint)!bVar13 *
                                                                           auVar106._4_4_,
                                                                           (uint)(bVar84 & 1) *
                                                                           (int)fVar177 |
                                                                           (uint)!(bool)(bVar84 & 1)
                                                                           * auVar106._0_4_))))))));
                auVar106 = vsubps_avx(auVar178,auVar69);
                local_260._0_4_ =
                     (uint)(bVar84 & 1) * (int)fVar166 | (uint)!(bool)(bVar84 & 1) * auVar106._0_4_;
                bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
                local_260._4_4_ = (uint)bVar13 * (int)fVar147 | (uint)!bVar13 * auVar106._4_4_;
                bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                local_260._8_4_ = (uint)bVar13 * (int)fVar175 | (uint)!bVar13 * auVar106._8_4_;
                bVar13 = (bool)((byte)(uVar90 >> 3) & 1);
                local_260._12_4_ = (uint)bVar13 * (int)fVar176 | (uint)!bVar13 * auVar106._12_4_;
                bVar13 = (bool)((byte)(uVar90 >> 4) & 1);
                local_260._16_4_ = (uint)bVar13 * (int)fVar141 | (uint)!bVar13 * auVar106._16_4_;
                bVar13 = (bool)((byte)(uVar90 >> 5) & 1);
                local_260._20_4_ = (uint)bVar13 * (int)fVar142 | (uint)!bVar13 * auVar106._20_4_;
                bVar13 = (bool)((byte)(uVar90 >> 6) & 1);
                local_260._24_4_ = (uint)bVar13 * (int)fVar143 | (uint)!bVar13 * auVar106._24_4_;
                bVar13 = SUB81(uVar90 >> 7,0);
                local_260._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar106._28_4_;
                auVar198 = ZEXT3264(auVar118);
              }
            }
            auVar196 = ZEXT3264(local_5e0);
            if (local_2d0 == 0) goto LAB_01d554ab;
            auVar106 = vsubps_avx(ZEXT1632(auVar96),auVar101);
            local_500 = in_ZMM20._0_32_;
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_500,auVar101);
            auVar155._0_4_ = auVar106._0_4_ + auVar106._0_4_;
            auVar155._4_4_ = auVar106._4_4_ + auVar106._4_4_;
            auVar155._8_4_ = auVar106._8_4_ + auVar106._8_4_;
            auVar155._12_4_ = auVar106._12_4_ + auVar106._12_4_;
            auVar155._16_4_ = auVar106._16_4_ + auVar106._16_4_;
            auVar155._20_4_ = auVar106._20_4_ + auVar106._20_4_;
            auVar155._24_4_ = auVar106._24_4_ + auVar106._24_4_;
            auVar155._28_4_ = auVar106._28_4_ + auVar106._28_4_;
            uVar148 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar30._4_4_ = uVar148;
            auVar30._0_4_ = uVar148;
            auVar30._8_4_ = uVar148;
            auVar30._12_4_ = uVar148;
            auVar30._16_4_ = uVar148;
            auVar30._20_4_ = uVar148;
            auVar30._24_4_ = uVar148;
            auVar30._28_4_ = uVar148;
            auVar106 = vmulps_avx512vl(auVar155,auVar30);
            local_520 = auVar198._0_32_;
            uVar149 = vcmpps_avx512vl(local_520,auVar106,6);
            local_2d0 = local_2d0 & (byte)uVar149;
            if (local_2d0 == 0) goto LAB_01d554ab;
            auVar156._8_4_ = 0xbf800000;
            auVar156._0_8_ = 0xbf800000bf800000;
            auVar156._12_4_ = 0xbf800000;
            auVar156._16_4_ = 0xbf800000;
            auVar156._20_4_ = 0xbf800000;
            auVar156._24_4_ = 0xbf800000;
            auVar156._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_360 = vfmadd132ps_avx512vl(local_260,auVar156,auVar31);
            local_260 = local_360;
            auVar106 = local_260;
            local_320 = (undefined4)lVar86;
            local_300 = local_470._0_8_;
            uStack_2f8 = local_470._8_8_;
            local_2f0 = local_480._0_8_;
            uStack_2e8 = local_480._8_8_;
            local_2e0 = local_490._0_8_;
            uStack_2d8 = local_490._8_8_;
            pGVar11 = (context->scene->geometries).items[local_698].ptr;
            local_660 = (undefined1  [8])pGVar11;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar84 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar84 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar118 = vaddps_avx512vl(local_500,_DAT_02020f40);
              auVar94 = vcvtsi2ss_avx512f(auVar197._0_16_,local_320);
              fVar166 = auVar94._0_4_;
              local_2c0[0] = (fVar166 + auVar118._0_4_) * local_460;
              local_2c0[1] = (fVar166 + auVar118._4_4_) * fStack_45c;
              local_2c0[2] = (fVar166 + auVar118._8_4_) * fStack_458;
              local_2c0[3] = (fVar166 + auVar118._12_4_) * fStack_454;
              fStack_2b0 = (fVar166 + auVar118._16_4_) * fStack_450;
              fStack_2ac = (fVar166 + auVar118._20_4_) * fStack_44c;
              fStack_2a8 = (fVar166 + auVar118._24_4_) * fStack_448;
              fStack_2a4 = fVar166 + auVar118._28_4_;
              local_260._0_8_ = local_360._0_8_;
              local_260._8_8_ = local_360._8_8_;
              local_260._16_8_ = local_360._16_8_;
              local_260._24_8_ = local_360._24_8_;
              local_2a0 = local_260._0_8_;
              uStack_298 = local_260._8_8_;
              uStack_290 = local_260._16_8_;
              uStack_288 = local_260._24_8_;
              local_280 = local_520;
              local_590 = local_470._0_4_;
              fStack_58c = local_470._4_4_;
              fStack_588 = local_470._8_4_;
              fStack_584 = local_470._12_4_;
              uVar90 = 0;
              uVar82 = (ulong)local_2d0;
              for (uVar83 = uVar82; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
                uVar90 = uVar90 + 1;
              }
              local_640 = local_480;
              local_210 = local_490._0_8_;
              uStack_208 = local_490._8_8_;
              uVar83 = 0x222bb01;
              local_568 = lVar86;
              local_380 = local_500;
              local_340 = local_520;
              local_31c = iVar10;
              local_310 = auVar20;
              local_260 = auVar106;
              do {
                local_630 = *(undefined4 *)(ray + k * 4 + 0x80);
                fVar166 = local_2c0[uVar90];
                local_3e0._4_4_ = fVar166;
                local_3e0._0_4_ = fVar166;
                local_3e0._8_4_ = fVar166;
                local_3e0._12_4_ = fVar166;
                local_3d0 = *(undefined4 *)((long)&local_2a0 + uVar90 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar90 * 4);
                local_690.context = context->user;
                fVar147 = 1.0 - fVar166;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar147),auVar23);
                auVar94 = ZEXT416((uint)(fVar166 * fVar147 * 4.0));
                auVar96 = vfnmsub213ss_fma(local_3e0,local_3e0,auVar94);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar94);
                fVar147 = fVar147 * auVar93._0_4_ * 0.5;
                fVar175 = auVar96._0_4_ * 0.5;
                fVar176 = auVar94._0_4_ * 0.5;
                fVar166 = fVar166 * fVar166 * 0.5;
                auVar169._0_4_ = fVar166 * (float)local_210;
                auVar169._4_4_ = fVar166 * local_210._4_4_;
                auVar169._8_4_ = fVar166 * (float)uStack_208;
                auVar169._12_4_ = fVar166 * uStack_208._4_4_;
                auVar152._4_4_ = fVar176;
                auVar152._0_4_ = fVar176;
                auVar152._8_4_ = fVar176;
                auVar152._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar152,auVar169,local_640);
                auVar170._4_4_ = fVar175;
                auVar170._0_4_ = fVar175;
                auVar170._8_4_ = fVar175;
                auVar170._12_4_ = fVar175;
                auVar77._4_4_ = fStack_58c;
                auVar77._0_4_ = local_590;
                auVar77._8_4_ = fStack_588;
                auVar77._12_4_ = fStack_584;
                auVar94 = vfmadd132ps_fma(auVar170,auVar94,auVar77);
                auVar153._4_4_ = fVar147;
                auVar153._0_4_ = fVar147;
                auVar153._8_4_ = fVar147;
                auVar153._12_4_ = fVar147;
                auVar94 = vfmadd213ps_fma(auVar153,auVar20,auVar94);
                uVar148 = auVar94._0_4_;
                local_410._4_4_ = uVar148;
                local_410._0_4_ = uVar148;
                local_410._8_4_ = uVar148;
                local_410._12_4_ = uVar148;
                local_400 = vshufps_avx(auVar94,auVar94,0x55);
                local_3f0 = vshufps_avx(auVar94,auVar94,0xaa);
                local_3c0 = local_580._0_8_;
                uStack_3b8 = local_580._8_8_;
                local_3b0 = local_5f0;
                vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                uStack_39c = (local_690.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_690.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_6b0 = local_4a0._0_8_;
                uStack_6a8 = local_4a0._8_8_;
                local_690.valid = (int *)&local_6b0;
                local_690.geometryUserPtr = *(void **)((long)local_660 + 0x18);
                local_690.hit = local_410;
                local_690.N = 4;
                local_600._0_4_ = (int)uVar83;
                local_610._0_8_ = uVar82;
                local_620._0_8_ = uVar90;
                uVar85 = uVar90;
                local_690.ray = (RTCRayN *)ray;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                if (*(code **)((long)local_660 + 0x48) != (code *)0x0) {
                  (**(code **)((long)local_660 + 0x48))(&local_690);
                  uVar83 = (ulong)(uint)local_600._0_4_;
                  uVar82 = local_610._0_8_;
                  uVar85 = local_620._0_8_;
                }
                auVar74._8_8_ = uStack_6a8;
                auVar74._0_8_ = local_6b0;
                uVar90 = vptestmd_avx512vl(auVar74,auVar74);
                if ((uVar90 & 0xf) != 0) {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_660 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_690);
                    uVar83 = (ulong)(uint)local_600._0_4_;
                    uVar82 = local_610._0_8_;
                    uVar85 = local_620._0_8_;
                  }
                  auVar93 = auVar200._0_16_;
                  auVar75._8_8_ = uStack_6a8;
                  auVar75._0_8_ = local_6b0;
                  auVar94 = *(undefined1 (*) [16])(local_690.ray + 0x80);
                  uVar90 = vptestmd_avx512vl(auVar75,auVar75);
                  uVar90 = uVar90 & 0xf;
                  auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar90 & 1);
                  auVar100._0_4_ = (uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar94._0_4_;
                  bVar13 = (bool)((byte)(uVar90 >> 1) & 1);
                  auVar100._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar94._4_4_;
                  bVar13 = (bool)((byte)(uVar90 >> 2) & 1);
                  auVar100._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar94._8_4_;
                  bVar13 = SUB81(uVar90 >> 3,0);
                  auVar100._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar94._12_4_;
                  *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar100;
                  if ((byte)uVar90 != 0) break;
                }
                auVar93 = auVar200._0_16_;
                *(undefined4 *)(ray + k * 4 + 0x80) = local_630;
                uVar90 = 0;
                uVar82 = uVar82 ^ 1L << (uVar85 & 0x3f);
                for (uVar85 = uVar82; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000)
                {
                  uVar90 = uVar90 + 1;
                }
                uVar83 = CONCAT71((int7)(uVar83 >> 8),uVar82 != 0);
              } while (uVar82 != 0);
              bVar84 = (byte)uVar83 & 1;
              auVar94 = vxorps_avx512vl(auVar93,auVar93);
              auVar200 = ZEXT1664(auVar94);
              in_ZMM20 = ZEXT3264(local_500);
              auVar198 = ZEXT3264(local_520);
              auVar199 = ZEXT3264(local_4c0);
              auVar192 = ZEXT3264(local_4e0);
              auVar196 = ZEXT3264(local_5e0);
              lVar86 = local_568;
            }
            bVar81 = (bool)(bVar81 | bVar84);
          }
          auVar179 = ZEXT3264(auVar105);
          auVar158 = ZEXT3264(auVar107);
          local_520 = auVar198._0_32_;
          lVar86 = lVar86 + 8;
          auVar197 = auVar192;
        } while ((int)lVar86 < iVar10);
      }
      if (bVar81 != false) {
        return bVar89;
      }
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar27._4_4_ = uVar148;
      auVar27._0_4_ = uVar148;
      auVar27._8_4_ = uVar148;
      auVar27._12_4_ = uVar148;
      auVar27._16_4_ = uVar148;
      auVar27._20_4_ = uVar148;
      auVar27._24_4_ = uVar148;
      auVar27._28_4_ = uVar148;
      uVar149 = vcmpps_avx512vl(local_80,auVar27,2);
      uVar87 = (uint)uVar88 & (uint)uVar149;
      uVar88 = (ulong)uVar87;
      bVar89 = uVar87 != 0;
    } while (bVar89);
  }
  return bVar89;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }